

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  char *__s;
  double rob_1;
  double ppr [3];
  double local_318;
  double local_310;
  double local_308;
  double bpia;
  int idmsf [4];
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double dStack_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double eo;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  double epsa;
  double da_1;
  double dStack_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double di_2;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_88;
  double phi_1;
  double gam;
  double pa;
  double chia;
  int status;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double thetaa;
  double zetaa;
  double za;
  
  if (1 < argc) {
    verbose = 1;
  }
  status = 0;
  iauA2af(4,2.345,(char *)&eo,idmsf);
  viv((int)eo._0_1_,0x2b,"iauA2af","s",&status);
  viv(idmsf[0],0x86,"iauA2af","0",&status);
  viv(idmsf[1],0x15,"iauA2af","1",&status);
  viv(idmsf[2],0x1e,"iauA2af","2",&status);
  viv(idmsf[3],0x25ea,"iauA2af","3",&status);
  iauA2tf(4,-3.01234,(char *)&eo,idmsf);
  viv((int)eo._0_1_,0x2d,"iauA2tf","s",&status);
  viv(idmsf[0],0xb,"iauA2tf","0",&status);
  viv(idmsf[1],0x1e,"iauA2tf","1",&status);
  viv(idmsf[2],0x16,"iauA2tf","2",&status);
  viv(idmsf[3],0x1954,"iauA2tf","3",&status);
  idmsf[0] = -0x4f682265;
  idmsf[1] = -0x401793b5;
  idmsf[2] = -0x7458faa;
  idmsf[3] = -0x401c8594;
  eo = 2.1044018893653786e-05;
  dStack_1f0 = -8.910892330442932e-05;
  local_1e8 = -3.863371479771657e-05;
  iauAb((double *)idmsf,&eo,0.9998092139570879,0.9999999950620926,ppr);
  vvd(ppr[0],-0.7631631094219556,1e-12,"iauAb","1",&status);
  vvd(ppr[1],-0.6087553082505591,1e-12,"iauAb","2",&status);
  vvd(ppr[2],-0.21679262693684712,1e-12,"iauAb","3",&status);
  iauAe2hd(5.5,1.1,0.7,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.593329111550731,1e-14,"iauAe2hd","h",&status);
  vvd(eo,0.9613934761647818,1e-14,"iauAe2hd","d",&status);
  iVar2 = iauAf2a('-',0x2d,0xd,27.2,(double *)idmsf);
  vvd((double)idmsf._0_8_,-0.7893115794313644,1e-12,"iauAf2a","a",&status);
  viv(iVar2,0,"iauAf2a","j",&status);
  dVar1 = iauAnp(-0.1);
  vvd(dVar1,6.183185307179587,1e-12,"iauAnp","",&status);
  dVar1 = iauAnpm(-4.0);
  vvd(dVar1,2.2831853071795867,1e-12,"iauAnpm","",&status);
  eo = 0.901310875;
  dStack_1f0 = -0.417402664;
  local_1e8 = -0.180982288;
  dStack_1e0 = 0.00742727954;
  local_1d8 = 0.0140507459;
  dStack_1d0 = 0.00609045792;
  ppr[0] = 0.903358544;
  ppr[1] = -0.415395237;
  ppr[2] = -0.180084014;
  iauApcg(2456165.5,0.401182685,(double (*) [3])&eo,ppr,(iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,12.651337940273786,1e-11,"iauApcg","pmt",&status);
  vvd((double)idmsf._8_8_,0.901310875,1e-12,"iauApcg","eb(1)",&status);
  vvd(-0.21676408580639883,-0.417402664,1e-12,"iauApcg","eb(2)",&status);
  vvd(dStack_2e0,-0.180982288,1e-12,"iauApcg","eb(3)",&status);
  vvd(local_2d8,0.8940025429324143,1e-12,"iauApcg","eh(1)",&status);
  vvd(dStack_2d0,-0.41109302686798177,1e-12,"iauApcg","eh(2)",&status);
  vvd(local_2c8,-0.17821890048728703,1e-12,"iauApcg","eh(3)",&status);
  vvd(dStack_2c0,1.0104652958110132,1e-12,"iauApcg","em",&status);
  vvd(local_2b8,4.289638913597694e-05,1e-16,"iauApcg","v(1)",&status);
  vvd(dStack_2b0,8.11503405158132e-05,1e-16,"iauApcg","v(2)",&status);
  vvd(local_2a8,3.517555136380563e-05,1e-16,"iauApcg","v(3)",&status);
  vvd(dStack_2a0,0.9999999951686013,1e-12,"iauApcg","bm1",&status);
  vvd(local_298,1.0,0.0,"iauApcg","bpn(1,1)",&status);
  vvd(dStack_280,0.0,0.0,"iauApcg","bpn(2,1)",&status);
  vvd(local_268,0.0,0.0,"iauApcg","bpn(3,1)",&status);
  vvd(dStack_290,0.0,0.0,"iauApcg","bpn(1,2)",&status);
  vvd(local_278,1.0,0.0,"iauApcg","bpn(2,2)",&status);
  vvd(dStack_260,0.0,0.0,"iauApcg","bpn(3,2)",&status);
  vvd(local_288,0.0,0.0,"iauApcg","bpn(1,3)",&status);
  vvd(dStack_270,0.0,0.0,"iauApcg","bpn(2,3)",&status);
  vvd(local_258,1.0,0.0,"iauApcg","bpn(3,3)",&status);
  iauApcg13(2456165.5,0.401182685,(iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,12.651337940273786,1e-11,"iauApcg13","pmt",&status);
  vvd((double)idmsf._8_8_,0.9013108747340645,1e-12,"iauApcg13","eb(1)",&status);
  vvd(-0.21676408580639883,-0.417402664040612,1e-12,"iauApcg13","eb(2)",&status);
  vvd(dStack_2e0,-0.18098228778678177,1e-12,"iauApcg13","eb(3)",&status);
  vvd(local_2d8,0.8940025429255499,1e-12,"iauApcg13","eh(1)",&status);
  vvd(dStack_2d0,-0.41109302683318966,1e-12,"iauApcg13","eh(2)",&status);
  vvd(local_2c8,-0.17821890060197498,1e-12,"iauApcg13","eh(3)",&status);
  vvd(dStack_2c0,1.0104652959646643,1e-12,"iauApcg13","em",&status);
  vvd(local_2b8,4.289638912941341e-05,1e-16,"iauApcg13","v(1)",&status);
  vvd(dStack_2b0,8.115034032405042e-05,1e-16,"iauApcg13","v(2)",&status);
  vvd(local_2a8,3.5175551355364706e-05,1e-16,"iauApcg13","v(3)",&status);
  vvd(dStack_2a0,0.9999999951686013,1e-12,"iauApcg13","bm1",&status);
  vvd(local_298,1.0,0.0,"iauApcg13","bpn(1,1)",&status);
  vvd(dStack_280,0.0,0.0,"iauApcg13","bpn(2,1)",&status);
  vvd(local_268,0.0,0.0,"iauApcg13","bpn(3,1)",&status);
  vvd(dStack_290,0.0,0.0,"iauApcg13","bpn(1,2)",&status);
  vvd(local_278,1.0,0.0,"iauApcg13","bpn(2,2)",&status);
  vvd(dStack_260,0.0,0.0,"iauApcg13","bpn(3,2)",&status);
  vvd(local_288,0.0,0.0,"iauApcg13","bpn(1,3)",&status);
  vvd(dStack_270,0.0,0.0,"iauApcg13","bpn(2,3)",&status);
  vvd(local_258,1.0,0.0,"iauApcg13","bpn(3,3)",&status);
  eo = 0.901310875;
  dStack_1f0 = -0.417402664;
  local_1e8 = -0.180982288;
  dStack_1e0 = 0.00742727954;
  local_1d8 = 0.0140507459;
  dStack_1d0 = 0.00609045792;
  ppr[0] = 0.903358544;
  ppr[1] = -0.415395237;
  ppr[2] = -0.180084014;
  iauApci(2456165.5,0.401182685,(double (*) [3])&eo,ppr,0.0013122272,-2.92808623e-05,3.05749468e-08,
          (iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,12.651337940273786,1e-11,"iauApci","pmt",&status);
  vvd((double)idmsf._8_8_,0.901310875,1e-12,"iauApci","eb(1)",&status);
  vvd(-0.21676408580639883,-0.417402664,1e-12,"iauApci","eb(2)",&status);
  vvd(dStack_2e0,-0.180982288,1e-12,"iauApci","eb(3)",&status);
  vvd(local_2d8,0.8940025429324143,1e-12,"iauApci","eh(1)",&status);
  vvd(dStack_2d0,-0.41109302686798177,1e-12,"iauApci","eh(2)",&status);
  vvd(local_2c8,-0.17821890048728703,1e-12,"iauApci","eh(3)",&status);
  vvd(dStack_2c0,1.0104652958110132,1e-12,"iauApci","em",&status);
  vvd(local_2b8,4.289638913597694e-05,1e-16,"iauApci","v(1)",&status);
  vvd(dStack_2b0,8.11503405158132e-05,1e-16,"iauApci","v(2)",&status);
  vvd(local_2a8,3.517555136380563e-05,1e-16,"iauApci","v(3)",&status);
  vvd(dStack_2a0,0.9999999951686013,1e-12,"iauApci","bm1",&status);
  vvd(local_298,0.9999991390295159,1e-12,"iauApci","bpn(1,1)",&status);
  vvd(dStack_280,4.978650072505017e-08,1e-12,"iauApci","bpn(2,1)",&status);
  vvd(local_268,0.0013122272,1e-12,"iauApci","bpn(3,1)",&status);
  vvd(dStack_290,-1.1363366537716096e-08,1e-12,"iauApci","bpn(1,2)",&status);
  vvd(local_278,0.9999999995713155,1e-12,"iauApci","bpn(2,2)",&status);
  vvd(dStack_260,-2.92808623e-05,1e-12,"iauApci","bpn(3,2)",&status);
  vvd(local_288,-0.0013122272008952603,1e-12,"iauApci","bpn(1,3)",&status);
  vvd(dStack_270,2.928082217872316e-05,1e-12,"iauApci","bpn(2,3)",&status);
  vvd(local_258,0.9999991386008323,1e-12,"iauApci","bpn(3,3)",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,&eo);
  vvd((double)idmsf._0_8_,12.651337940273786,1e-11,"iauApci13","pmt",&status);
  vvd((double)idmsf._8_8_,0.9013108747340645,1e-12,"iauApci13","eb(1)",&status);
  vvd(-0.21676408580639883,-0.417402664040612,1e-12,"iauApci13","eb(2)",&status);
  vvd(dStack_2e0,-0.18098228778678177,1e-12,"iauApci13","eb(3)",&status);
  vvd(local_2d8,0.8940025429255499,1e-12,"iauApci13","eh(1)",&status);
  vvd(dStack_2d0,-0.41109302683318966,1e-12,"iauApci13","eh(2)",&status);
  vvd(local_2c8,-0.17821890060197498,1e-12,"iauApci13","eh(3)",&status);
  vvd(dStack_2c0,1.0104652959646643,1e-12,"iauApci13","em",&status);
  vvd(local_2b8,4.289638912941341e-05,1e-16,"iauApci13","v(1)",&status);
  vvd(dStack_2b0,8.115034032405042e-05,1e-16,"iauApci13","v(2)",&status);
  vvd(local_2a8,3.5175551355364706e-05,1e-16,"iauApci13","v(3)",&status);
  vvd(dStack_2a0,0.9999999951686013,1e-12,"iauApci13","bm1",&status);
  vvd(local_298,0.9999992060376762,1e-12,"iauApci13","bpn(1,1)",&status);
  vvd(dStack_280,4.124244860106037e-08,1e-12,"iauApci13","bpn(2,1)",&status);
  vvd(local_268,0.0012601285710517097,1e-12,"iauApci13","bpn(3,1)",&status);
  vvd(dStack_290,-1.2822919872221307e-08,1e-12,"iauApci13","bpn(1,2)",&status);
  vvd(local_278,0.9999999997456835,1e-12,"iauApci13","bpn(2,2)",&status);
  vvd(dStack_260,-2.255288829420525e-05,1e-12,"iauApci13","bpn(3,2)",&status);
  vvd(local_288,-0.0012601285716613746,1e-12,"iauApci13","bpn(1,3)",&status);
  vvd(dStack_270,2.2552854229533955e-05,1e-12,"iauApci13","bpn(2,3)",&status);
  vvd(local_258,0.9999992057833604,1e-12,"iauApci13","bpn(3,3)",&status);
  vvd(eo,-0.0029006187126573756,1e-12,"iauApci13","eo",&status);
  eo = -0.974170438;
  dStack_1f0 = -0.211520082;
  local_1e8 = -0.0917583024;
  dStack_1e0 = 0.00364365824;
  local_1d8 = -0.0154287319;
  dStack_1d0 = -0.00668922024;
  ppr[0] = -0.973458265;
  ppr[1] = -0.209215307;
  ppr[2] = -0.0906996477;
  iauApco(2456384.5,0.970031644,(double (*) [3])&eo,ppr,0.0013122272,-2.92808623e-05,3.05749468e-08,
          3.14540971,-0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,-3.01974337e-11,
          0.000201418779,-2.36140831e-07,(iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,13.252484686225873,1e-11,"iauApco","pmt",&status);
  vvd((double)idmsf._8_8_,-0.9741827110630322,1e-12,"iauApco","eb(1)",&status);
  vvd(-0.21676408580639883,-0.21151301901353448,1e-12,"iauApco","eb(2)",&status);
  vvd(dStack_2e0,-0.09179840186949532,1e-12,"iauApco","eb(3)",&status);
  vvd(local_2d8,-0.9736425571689739,1e-12,"iauApco","eh(1)",&status);
  vvd(dStack_2d0,-0.2092452125849331,1e-12,"iauApco","eh(2)",&status);
  vvd(local_2c8,-0.09075578152243273,1e-12,"iauApco","eh(3)",&status);
  vvd(dStack_2c0,0.9998233241709957,1e-12,"iauApco","em",&status);
  vvd(local_2b8,2.0787049929167286e-05,1e-16,"iauApco","v(1)",&status);
  vvd(dStack_2b0,-8.955360107151952e-05,1e-16,"iauApco","v(2)",&status);
  vvd(local_2a8,-3.863338994288951e-05,1e-16,"iauApco","v(3)",&status);
  vvd(dStack_2a0,0.9999999950277562,1e-12,"iauApco","bm1",&status);
  vvd(local_298,0.9999991390295159,1e-12,"iauApco","bpn(1,1)",&status);
  vvd(dStack_280,4.978650072505017e-08,1e-12,"iauApco","bpn(2,1)",&status);
  vvd(local_268,0.0013122272,1e-12,"iauApco","bpn(3,1)",&status);
  vvd(dStack_290,-1.1363366537716096e-08,1e-12,"iauApco","bpn(1,2)",&status);
  vvd(local_278,0.9999999995713155,1e-12,"iauApco","bpn(2,2)",&status);
  vvd(dStack_260,-2.92808623e-05,1e-12,"iauApco","bpn(3,2)",&status);
  vvd(local_288,-0.0013122272008952603,1e-12,"iauApco","bpn(1,3)",&status);
  vvd(dStack_270,2.928082217872316e-05,1e-12,"iauApco","bpn(2,3)",&status);
  vvd(local_258,0.9999991386008323,1e-12,"iauApco","bpn(3,3)",&status);
  vvd(dStack_250,-0.5278008060295996,1e-12,"iauApco","along",&status);
  vvd(dStack_240,1.133427418130753e-06,1e-17,"iauApco","xpl",&status);
  vvd(local_238,1.4533475957806462e-06,1e-17,"iauApco","ypl",&status);
  vvd(local_230,-0.9440115679003211,1e-12,"iauApco","sphi",&status);
  vvd(local_228,0.3299123514971475,1e-12,"iauApco","cphi",&status);
  vvd(local_220,0.0,0.0,"iauApco","diurab",&status);
  vvd(local_218,2.6176089039704005,1e-12,"iauApco","eral",&status);
  vvd(local_210,0.000201418779,1e-15,"iauApco","refa",&status);
  vvd(local_208,-2.36140831e-07,1e-18,"iauApco","refb",&status);
  iVar2 = iauApco13(2456384.5,0.969254051,0.1550675,-0.527800806,-1.2345856,2738.0,2.47230737e-07,
                    1.82640464e-06,731.0,12.8,0.59,0.55,(iauASTROM *)idmsf,&eo);
  vvd((double)idmsf._0_8_,13.252484686224758,1e-11,"iauApco13","pmt",&status);
  vvd((double)idmsf._8_8_,-0.9741827107320875,1e-12,"iauApco13","eb(1)",&status);
  vvd(-0.21676408580639883,-0.21151301904897166,1e-12,"iauApco13","eb(2)",&status);
  vvd(dStack_2e0,-0.09179840189496756,1e-12,"iauApco13","eb(3)",&status);
  vvd(local_2d8,-0.9736425572586935,1e-12,"iauApco13","eh(1)",&status);
  vvd(dStack_2d0,-0.20924521216033362,1e-12,"iauApco13","eh(2)",&status);
  vvd(local_2c8,-0.09075578153885665,1e-12,"iauApco13","eh(3)",&status);
  vvd(dStack_2c0,0.9998233240913899,1e-12,"iauApco13","em",&status);
  vvd(local_2b8,2.0787049945204893e-05,1e-16,"iauApco13","v(1)",&status);
  vvd(dStack_2b0,-8.955360133238868e-05,1e-16,"iauApco13","v(2)",&status);
  vvd(local_2a8,-3.863338993055887e-05,1e-16,"iauApco13","v(3)",&status);
  vvd(dStack_2a0,0.999999995027756,1e-12,"iauApco13","bm1",&status);
  vvd(local_298,0.9999991390295148,1e-12,"iauApco13","bpn(1,1)",&status);
  vvd(dStack_280,4.9786500753155294e-08,1e-12,"iauApco13","bpn(2,1)",&status);
  vvd(local_268,0.0013122272008502934,1e-12,"iauApco13","bpn(3,1)",&status);
  vvd(dStack_290,-1.1363366528124865e-08,1e-12,"iauApco13","bpn(1,2)",&status);
  vvd(local_278,0.9999999995713155,1e-12,"iauApco13","bpn(2,2)",&status);
  vvd(dStack_260,-2.9280862309753673e-05,1e-12,"iauApco13","bpn(3,2)",&status);
  vvd(local_288,-0.0013122272017455537,1e-12,"iauApco13","bpn(1,3)",&status);
  vvd(dStack_270,2.928082218847679e-05,1e-12,"iauApco13","bpn(2,3)",&status);
  vvd(local_258,0.9999991386008312,1e-12,"iauApco13","bpn(3,3)",&status);
  vvd(dStack_250,-0.5278008060295996,1e-12,"iauApco13","along",&status);
  vvd(dStack_240,1.133427418130753e-06,1e-17,"iauApco13","xpl",&status);
  vvd(local_238,1.4533475957806462e-06,1e-17,"iauApco13","ypl",&status);
  vvd(local_230,-0.9440115679003211,1e-12,"iauApco13","sphi",&status);
  vvd(local_228,0.3299123514971475,1e-12,"iauApco13","cphi",&status);
  vvd(local_220,0.0,0.0,"iauApco13","diurab",&status);
  vvd(local_218,2.617608909189664,1e-12,"iauApco13","eral",&status);
  vvd(local_210,0.0002014187785940397,1e-15,"iauApco13","refa",&status);
  vvd(local_208,-2.3614083149436963e-07,1e-18,"iauApco13","refb",&status);
  vvd(eo,-0.0030205483548024128,1e-14,"iauApco13","eo",&status);
  viv(iVar2,0,"iauApco13","j",&status);
  eo = -1836024.09;
  dStack_1f0 = 1056607.72;
  local_1e8 = -5998795.26;
  dStack_1e0 = -77.0361767;
  local_1d8 = -133.310856;
  dStack_1d0 = 0.0971855934;
  ppr[0] = -0.974170438;
  ppr[1] = -0.211520082;
  ppr[2] = -0.0917583024;
  da_1 = -0.973458265;
  dStack_120 = -0.209215307;
  local_118 = -0.0906996477;
  iauApcs(2456384.5,0.970031644,(double (*) [3])&eo,&ppr,&da_1,(iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,13.252484686225873,1e-11,"iauApcs","pmt",&status);
  vvd((double)idmsf._8_8_,-0.9741827110629881,1e-12,"iauApcs","eb(1)",&status);
  vvd(-0.21676408580639883,-0.2115130190136416,1e-12,"iauApcs","eb(2)",&status);
  vvd(dStack_2e0,-0.09179840186954412,1e-12,"iauApcs","eb(3)",&status);
  vvd(local_2d8,-0.9736425571689454,1e-12,"iauApcs","eh(1)",&status);
  vvd(dStack_2d0,-0.20924521258504358,1e-12,"iauApcs","eh(2)",&status);
  vvd(local_2c8,-0.090755781522483,1e-12,"iauApcs","eh(3)",&status);
  vvd(dStack_2c0,0.9998233241709796,1e-12,"iauApcs","em",&status);
  vvd(local_2b8,2.0787049932826855e-05,1e-16,"iauApcs","v(1)",&status);
  vvd(dStack_2b0,-8.955360106989405e-05,1e-16,"iauApcs","v(2)",&status);
  vvd(local_2a8,-3.863338994289409e-05,1e-16,"iauApcs","v(3)",&status);
  vvd(dStack_2a0,0.9999999950277562,1e-12,"iauApcs","bm1",&status);
  vvd(local_298,1.0,0.0,"iauApcs","bpn(1,1)",&status);
  vvd(dStack_280,0.0,0.0,"iauApcs","bpn(2,1)",&status);
  vvd(local_268,0.0,0.0,"iauApcs","bpn(3,1)",&status);
  vvd(dStack_290,0.0,0.0,"iauApcs","bpn(1,2)",&status);
  vvd(local_278,1.0,0.0,"iauApcs","bpn(2,2)",&status);
  vvd(dStack_260,0.0,0.0,"iauApcs","bpn(3,2)",&status);
  vvd(local_288,0.0,0.0,"iauApcs","bpn(1,3)",&status);
  vvd(dStack_270,0.0,0.0,"iauApcs","bpn(2,3)",&status);
  vvd(local_258,1.0,0.0,"iauApcs","bpn(3,3)",&status);
  eo = -6241497.16;
  dStack_1f0 = 401346.896;
  local_1e8 = -1251136.04;
  dStack_1e0 = -29.264597;
  local_1d8 = -455.021831;
  dStack_1d0 = 0.0266151194;
  iauApcs13(2456165.5,0.401182685,(double (*) [3])&eo,(iauASTROM *)idmsf);
  vvd((double)idmsf._0_8_,12.651337940273786,1e-11,"iauApcs13","pmt",&status);
  vvd((double)idmsf._8_8_,0.9012691529025251,1e-12,"iauApcs13","eb(1)",&status);
  vvd(-0.21676408580639883,-0.4173999812023194,1e-12,"iauApcs13","eb(2)",&status);
  vvd(dStack_2e0,-0.18099065111464296,1e-12,"iauApcs13","eb(3)",&status);
  vvd(local_2d8,0.893993910176013,1e-12,"iauApcs13","eh(1)",&status);
  vvd(dStack_2d0,-0.41110538917340217,1e-12,"iauApcs13","eh(2)",&status);
  vvd(local_2c8,-0.17823368806369974,1e-12,"iauApcs13","eh(3)",&status);
  vvd(dStack_2c0,1.0104283843734911,1e-12,"iauApcs13","em",&status);
  vvd(local_2b8,4.279877294121698e-05,1e-16,"iauApcs13","v(1)",&status);
  vvd(dStack_2b0,7.963255087052121e-05,1e-16,"iauApcs13","v(2)",&status);
  vvd(local_2a8,3.517564013384692e-05,1e-16,"iauApcs13","v(3)",&status);
  vvd(dStack_2a0,0.9999999952947981,1e-12,"iauApcs13","bm1",&status);
  vvd(local_298,1.0,0.0,"iauApcs13","bpn(1,1)",&status);
  vvd(dStack_280,0.0,0.0,"iauApcs13","bpn(2,1)",&status);
  vvd(local_268,0.0,0.0,"iauApcs13","bpn(3,1)",&status);
  vvd(dStack_290,0.0,0.0,"iauApcs13","bpn(1,2)",&status);
  vvd(local_278,1.0,0.0,"iauApcs13","bpn(2,2)",&status);
  vvd(dStack_260,0.0,0.0,"iauApcs13","bpn(3,2)",&status);
  vvd(local_288,0.0,0.0,"iauApcs13","bpn(1,3)",&status);
  vvd(dStack_270,0.0,0.0,"iauApcs13","bpn(2,3)",&status);
  vvd(local_258,1.0,0.0,"iauApcs13","bpn(3,3)",&status);
  iauAper(5.678,(iauASTROM *)idmsf);
  vvd(local_218,6.912,1e-12,"iauAper","pmt",&status);
  iauAper13(2456165.5,0.401182685,(iauASTROM *)idmsf);
  vvd(local_218,3.316236661789695,1e-12,"iauAper13","pmt",&status);
  iauApio(-3.01974337e-11,3.14540971,-0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,
          0.000201418779,-2.36140831e-07,(iauASTROM *)idmsf);
  vvd(1.234,-0.5278008060295996,1e-12,"iauApio","along",&status);
  vvd(dStack_240,1.133427418130753e-06,1e-17,"iauApio","xpl",&status);
  vvd(local_238,1.4533475957806462e-06,1e-17,"iauApio","ypl",&status);
  vvd(local_230,-0.9440115679003211,1e-12,"iauApio","sphi",&status);
  vvd(local_228,0.3299123514971475,1e-12,"iauApio","cphi",&status);
  vvd(local_220,5.135843661699913e-07,1e-12,"iauApio","diurab",&status);
  vvd(local_218,2.6176089039704005,1e-12,"iauApio","eral",&status);
  vvd(local_210,0.000201418779,1e-15,"iauApio","refa",&status);
  vvd(local_208,-2.36140831e-07,1e-18,"iauApio","refb",&status);
  iVar2 = iauApio13(2456384.5,0.969254051,0.1550675,-0.527800806,-1.2345856,2738.0,2.47230737e-07,
                    1.82640464e-06,731.0,12.8,0.59,0.55,(iauASTROM *)idmsf);
  vvd(1.234,-0.5278008060295996,1e-12,"iauApio13","along",&status);
  vvd(dStack_240,1.133427418130753e-06,1e-17,"iauApio13","xpl",&status);
  vvd(local_238,1.4533475957806462e-06,1e-17,"iauApio13","ypl",&status);
  vvd(local_230,-0.9440115679003211,1e-12,"iauApio13","sphi",&status);
  vvd(local_228,0.3299123514971475,1e-12,"iauApio13","cphi",&status);
  vvd(local_220,5.135843661699913e-07,1e-12,"iauApio13","diurab",&status);
  vvd(local_218,2.617608909189664,1e-12,"iauApio13","eral",&status);
  vvd(local_210,0.0002014187785940397,1e-15,"iauApio13","refa",&status);
  vvd(local_208,-2.3614083149436963e-07,1e-18,"iauApio13","refb",&status);
  viv(iVar2,0,"iauApio13","j",&status);
  iauAtcc13(2.71,0.174,1e-05,5e-06,0.1,55.0,2456165.5,0.401182685,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.7101265045313725,1e-12,"iauAtcc13","ra",&status);
  vvd(eo,0.17406325376283502,1e-12,"iauAtcc13","da",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,&eo);
  iauAtccq(2.71,0.174,1e-05,5e-06,0.1,55.0,(iauASTROM *)idmsf,ppr,&da_1);
  vvd(ppr[0],2.7101265045313725,1e-12,"iauAtccq","ra",&status);
  vvd(da_1,0.17406325376283502,1e-12,"iauAtccq","da",&status);
  iauAtci13(2.71,0.174,1e-05,5e-06,0.1,55.0,2456165.5,0.401182685,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,2.710121572968697,1e-12,"iauAtci13","ri",&status);
  vvd(eo,0.1729371367219539,1e-12,"iauAtci13","di",&status);
  vvd(ppr[0],-0.0029006187126573756,1e-14,"iauAtci13","eo",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,&eo);
  iauAtciq(2.71,0.174,1e-05,5e-06,0.1,55.0,(iauASTROM *)idmsf,ppr,&da_1);
  vvd(ppr[0],2.710121572968697,1e-12,"iauAtciq","ri",&status);
  vvd(da_1,0.1729371367219539,1e-12,"iauAtciq","di",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,ppr);
  eo = 0.00028574;
  dStack_1f0 = 3e-10;
  local_1e8 = -7.81014427;
  dStack_1e0 = -5.60956681;
  local_1d8 = -1.98079819;
  dStack_1d0 = 0.0030723249;
  local_1c8 = -0.00406995477;
  dStack_1c0 = -0.00181335842;
  local_1b8 = 0.00095435;
  uStack_1b0 = 0x3e29c511dc3a41df;
  local_1a8 = 0x3fe79e815dc12ee7;
  uStack_1a0 = 0x40128bdd7109d871;
  local_198 = 0x3fff824efa3916a2;
  uStack_190 = 0xbf7ef55099e16b27;
  local_188 = 0x3f54cb25b6a8881c;
  uStack_180 = 0x3f47dae5f34ded8c;
  local_178 = 0x3ff0000000000000;
  uStack_170 = 0x3ed92a737110e454;
  local_168 = 0xbf475626d442001f;
  uStack_160 = 0xbf62e17af79f8baf;
  local_158 = 0xbf5158572781c0b4;
  uStack_150 = 0x3eda645c954fcecb;
  local_148 = 0xbe96349e84193e40;
  uStack_140 = 0xbe93e599f5373da2;
  iauAtciqn(2.71,0.174,1e-05,5e-06,0.1,55.0,(iauASTROM *)idmsf,3,(iauLDBODY *)&eo,&da_1,&di_2);
  vvd(da_1,2.7101220081049835,1e-12,"iauAtciqn","ri",&status);
  vvd(di_2,0.1729371916492768,1e-12,"iauAtciqn","di",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,&eo);
  iauAtciqz(2.71,0.174,(iauASTROM *)idmsf,ppr,&da_1);
  vvd(ppr[0],2.709994899247257,1e-12,"iauAtciqz","ri",&status);
  vvd(da_1,0.17287407209849318,1e-12,"iauAtciqz","di",&status);
  iVar2 = iauAtco13(2.71,0.174,1e-05,5e-06,0.1,55.0,2456384.5,0.969254051,0.1550675,-0.527800806,
                    -1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,0.55,
                    (double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,0.09251774485485516,1e-12,"iauAtco13","aob",&status);
  vvd(eo,1.4076614052564993,1e-12,"iauAtco13","zob",&status);
  vvd(ppr[0],-0.09265154431529725,1e-12,"iauAtco13","hob",&status);
  vvd(da_1,0.1716626560072526,1e-12,"iauAtco13","dob",&status);
  vvd(di_2,2.710260453504961,1e-12,"iauAtco13","rob",&status);
  vvd(rob_1,-0.0030205483548024128,1e-14,"iauAtco13","eo",&status);
  viv(iVar2,0,"iauAtco13","j",&status);
  iauAtic13(2.710121572969039,0.17293713672182304,2456165.5,0.401182685,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,2.7101265045317167,1e-12,"iauAtic13","rc",&status);
  vvd(eo,0.17406325376270346,1e-12,"iauAtic13","dc",&status);
  vvd(ppr[0],-0.0029006187126573756,1e-14,"iauAtic13","eo",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,&eo);
  iauAticq(2.710121572969039,0.17293713672182304,(iauASTROM *)idmsf,ppr,&da_1);
  vvd(ppr[0],2.7101265045317167,1e-12,"iauAticq","rc",&status);
  vvd(da_1,0.17406325376270346,1e-12,"iauAticq","dc",&status);
  iauApci13(2456165.5,0.401182685,(iauASTROM *)idmsf,ppr);
  eo = 0.00028574;
  dStack_1f0 = 3e-10;
  local_1e8 = -7.81014427;
  dStack_1e0 = -5.60956681;
  local_1d8 = -1.98079819;
  dStack_1d0 = 0.0030723249;
  local_1c8 = -0.00406995477;
  dStack_1c0 = -0.00181335842;
  local_1b8 = 0.00095435;
  uStack_1b0 = 0x3e29c511dc3a41df;
  local_1a8 = 0x3fe79e815dc12ee7;
  uStack_1a0 = 0x40128bdd7109d871;
  local_198 = 0x3fff824efa3916a2;
  uStack_190 = 0xbf7ef55099e16b27;
  local_188 = 0x3f54cb25b6a8881c;
  uStack_180 = 0x3f47dae5f34ded8c;
  local_178 = 0x3ff0000000000000;
  uStack_170 = 0x3ed92a737110e454;
  local_168 = 0xbf475626d442001f;
  uStack_160 = 0xbf62e17af79f8baf;
  local_158 = 0xbf5158572781c0b4;
  uStack_150 = 0x3eda645c954fcecb;
  local_148 = 0xbe96349e84193e40;
  uStack_140 = 0xbe93e599f5373da2;
  iauAticqn(2.709994899247599,0.17287407209836234,(iauASTROM *)idmsf,3,(iauLDBODY *)&eo,&da_1,&di_2)
  ;
  vvd(da_1,2.7099995750330272,1e-12,"iauAtciqn","rc",&status);
  vvd(di_2,0.173999965631647,1e-12,"iauAtciqn","dc",&status);
  iVar2 = iauAtio13(2.710121572969039,0.17293713672182304,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo,ppr,&da_1,&di_2);
  vvd((double)idmsf._0_8_,0.09233952224895123,1e-12,"iauAtio13","aob",&status);
  vvd(eo,1.40775870451355,1e-12,"iauAtio13","zob",&status);
  vvd(ppr[0],-0.09247619879881698,1e-12,"iauAtio13","hob",&status);
  vvd(da_1,0.17176534357562348,1e-12,"iauAtio13","dob",&status);
  vvd(di_2,2.7100851079884807,1e-12,"iauAtio13","rob",&status);
  viv(iVar2,0,"iauAtio13","j",&status);
  iauApio13(2456384.5,0.969254051,0.1550675,-0.527800806,-1.2345856,2738.0,2.47230737e-07,
            1.82640464e-06,731.0,12.8,0.59,0.55,(iauASTROM *)idmsf);
  iauAtioq(2.710121572969039,0.17293713672182304,(iauASTROM *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd(eo,0.09233952224895123,1e-12,"iauAtioq","aob",&status);
  vvd(ppr[0],1.40775870451355,1e-12,"iauAtioq","zob",&status);
  vvd(da_1,-0.09247619879881698,1e-12,"iauAtioq","hob",&status);
  vvd(di_2,0.17176534357562348,1e-12,"iauAtioq","dob",&status);
  vvd(rob_1,2.7100851079884807,1e-12,"iauAtioq","rob",&status);
  iVar2 = iauAtoc13("R",2.7100851079868864,0.1717653435758265,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.709956744659136,1e-12,"iauAtoc13","R/rc",&status);
  vvd(eo,0.17416965008984714,1e-12,"iauAtoc13","R/dc",&status);
  viv(iVar2,0,"iauAtoc13","R/j",&status);
  iVar2 = iauAtoc13("H",-0.09247619879782006,0.1717653435758265,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.709956744659734,1e-12,"iauAtoc13","H/rc",&status);
  vvd(eo,0.17416965008984714,1e-12,"iauAtoc13","H/dc",&status);
  viv(iVar2,0,"iauAtoc13","H/j",&status);
  iVar2 = iauAtoc13("A",0.0923395222479499,1.4077587045137225,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.709956744659734,1e-12,"iauAtoc13","A/rc",&status);
  vvd(eo,0.17416965008984714,1e-12,"iauAtoc13","A/dc",&status);
  viv(iVar2,0,"iauAtoc13","A/j",&status);
  iVar2 = iauAtoi13("R",2.7100851079868864,0.1717653435758265,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.7101215744475406,1e-12,"iauAtoi13","R/ri",&status);
  vvd(eo,0.17293718391166088,1e-12,"iauAtoi13","R/di",&status);
  viv(iVar2,0,"iauAtoi13","R/J",&status);
  iVar2 = iauAtoi13("H",-0.09247619879782006,0.1717653435758265,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.710121574448139,1e-12,"iauAtoi13","H/ri",&status);
  vvd(eo,0.17293718391166088,1e-12,"iauAtoi13","H/di",&status);
  viv(iVar2,0,"iauAtoi13","H/J",&status);
  iVar2 = iauAtoi13("A",0.0923395222479499,1.4077587045137225,2456384.5,0.969254051,0.1550675,
                    -0.527800806,-1.2345856,2738.0,2.47230737e-07,1.82640464e-06,731.0,12.8,0.59,
                    0.55,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2.710121574448139,1e-12,"iauAtoi13","A/ri",&status);
  vvd(eo,0.17293718391166088,1e-12,"iauAtoi13","A/di",&status);
  viv(iVar2,0,"iauAtoi13","A/J",&status);
  iauApio13(2456384.5,0.969254051,0.1550675,-0.527800806,-1.2345856,2738.0,2.47230737e-07,
            1.82640464e-06,731.0,12.8,0.59,0.55,(iauASTROM *)idmsf);
  iauAtoiq("R",2.7100851079868864,0.1717653435758265,(iauASTROM *)idmsf,&eo,ppr);
  vvd(eo,2.7101215744475406,1e-12,"iauAtoiq","R/ri",&status);
  vvd(ppr[0],0.17293718391166088,1e-12,"iauAtoiq","R/di",&status);
  iauAtoiq("H",-0.09247619879782006,0.1717653435758265,(iauASTROM *)idmsf,&eo,ppr);
  vvd(eo,2.710121574448139,1e-12,"iauAtoiq","H/ri",&status);
  vvd(ppr[0],0.17293718391166088,1e-12,"iauAtoiq","H/di",&status);
  iauAtoiq("A",0.0923395222479499,1.4077587045137225,(iauASTROM *)idmsf,&eo,ppr);
  vvd(eo,2.710121574448139,1e-12,"iauAtoiq","A/ri",&status);
  vvd(ppr[0],0.17293718391166088,1e-12,"iauAtoiq","A/di",&status);
  iauBi00((double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,-2.0253091528350866e-07,1e-12,"iauBi00","dpsibi",&status);
  vvd(eo,-3.3060414542221477e-08,1e-12,"iauBi00","depsbi",&status);
  vvd(ppr[0],-7.078279744199226e-08,1e-12,"iauBi00","dra",&status);
  iauBp00(2400000.5,50123.9999,(double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauBp00","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078279744199197e-08,1e-16,"iauBp00","rb12",&status);
  vvd(-0.21676408580639883,8.056217146976134e-08,1e-16,"iauBp00","rb13",&status);
  vvd(dStack_2e0,7.078279477857338e-08,1e-16,"iauBp00","rb21",&status);
  vvd(local_2d8,0.999999999999997,1e-12,"iauBp00","rb22",&status);
  vvd(dStack_2d0,3.3060414542221364e-08,1e-16,"iauBp00","rb23",&status);
  vvd(local_2c8,-8.056217380986972e-08,1e-16,"iauBp00","rb31",&status);
  vvd(dStack_2c0,-3.3060408839805523e-08,1e-16,"iauBp00","rb32",&status);
  vvd(local_2b8,0.9999999999999962,1e-12,"iauBp00","rb33",&status);
  vvd(eo,0.9999995504864049,1e-12,"iauBp00","rp11",&status);
  vvd(dStack_1f0,0.0008696113836207084,1e-14,"iauBp00","rp12",&status);
  vvd(local_1e8,0.0003778928813389333,1e-14,"iauBp00","rp13",&status);
  vvd(dStack_1e0,-0.0008696113818227266,1e-14,"iauBp00","rp21",&status);
  vvd(local_1d8,0.9999996218879366,1e-12,"iauBp00","rp22",&status);
  vvd(dStack_1d0,-1.6906792630092422e-07,1e-14,"iauBp00","rp23",&status);
  vvd(local_1c8,-0.0003778928854764695,1e-14,"iauBp00","rp31",&status);
  vvd(dStack_1c0,-1.5955210041952866e-07,1e-14,"iauBp00","rp32",&status);
  vvd(local_1b8,0.9999999285984683,1e-12,"iauBp00","rp33",&status);
  vvd(ppr[0],0.9999995505175088,1e-12,"iauBp00","rbp11",&status);
  vvd(ppr[1],0.0008695405883617885,1e-14,"iauBp00","rbp12",&status);
  vvd(ppr[2],0.0003779734722239007,1e-14,"iauBp00","rbp13",&status);
  vvd(0.00364365824,-0.0008695405990410864,1e-14,"iauBp00","rbp21",&status);
  vvd(-0.0154287319,0.9999996219494925,1e-12,"iauBp00","rbp22",&status);
  vvd(-0.00668922024,-1.360775820404982e-07,1e-14,"iauBp00","rbp23",&status);
  vvd(local_318,-0.0003779734476558185,1e-14,"iauBp00","rbp31",&status);
  vvd(local_310,-1.925857585832024e-07,1e-14,"iauBp00","rbp32",&status);
  vvd(local_308,0.9999999285680153,1e-12,"iauBp00","rbp33",&status);
  iauBp06(2400000.5,50123.9999,(double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauBp06","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078368960971557e-08,1e-14,"iauBp06","rb12",&status);
  vvd(-0.21676408580639883,8.056213977613186e-08,1e-14,"iauBp06","rb13",&status);
  vvd(dStack_2e0,7.078368694637675e-08,1e-14,"iauBp06","rb21",&status);
  vvd(local_2d8,0.999999999999997,1e-12,"iauBp06","rb22",&status);
  vvd(dStack_2d0,3.305943742989134e-08,1e-14,"iauBp06","rb23",&status);
  vvd(local_2c8,-8.056214211620056e-08,1e-14,"iauBp06","rb31",&status);
  vvd(dStack_2c0,-3.305943172740587e-08,1e-14,"iauBp06","rb32",&status);
  vvd(local_2b8,0.9999999999999962,1e-12,"iauBp06","rb33",&status);
  vvd(eo,0.999999550486496,1e-12,"iauBp06","rp11",&status);
  vvd(dStack_1f0,0.0008696112578855405,1e-14,"iauBp06","rp12",&status);
  vvd(local_1e8,0.000377892929334139,1e-14,"iauBp06","rp13",&status);
  vvd(dStack_1e0,-0.0008696112560510187,1e-14,"iauBp06","rp21",&status);
  vvd(local_1d8,0.9999996218880459,1e-12,"iauBp06","rp22",&status);
  vvd(dStack_1d0,-1.6916461689418963e-07,1e-14,"iauBp06","rp23",&status);
  vvd(local_1c8,-0.0003778929335557603,1e-14,"iauBp06","rp31",&status);
  vvd(dStack_1c0,-1.594554040786495e-07,1e-14,"iauBp06","rp32",&status);
  vvd(local_1b8,0.9999999285984501,1e-12,"iauBp06","rp33",&status);
  vvd(ppr[0],0.9999995505176007,1e-12,"iauBp06","rbp11",&status);
  vvd(ppr[1],0.0008695404617348209,1e-14,"iauBp06","rbp12",&status);
  vvd(ppr[2],0.0003779735201865589,1e-14,"iauBp06","rbp13",&status);
  vvd(0.00364365824,-0.0008695404723772031,1e-14,"iauBp06","rbp21",&status);
  vvd(-0.0154287319,0.9999996219496027,1e-12,"iauBp06","rbp22",&status);
  vvd(-0.00668922024,-1.3617524970802702e-07,1e-14,"iauBp06","rbp23",&status);
  vvd(local_318,-0.00037797349570340897,1e-14,"iauBp06","rbp31",&status);
  vvd(local_310,-1.924880847894457e-07,1e-14,"iauBp06","rbp32",&status);
  vvd(local_308,0.9999999285679972,1e-12,"iauBp06","rbp33",&status);
  idmsf[0] = 0x1b25a5b8;
  idmsf[1] = 0x3feffff8;
  idmsf[2] = 0x1ee795c7;
  idmsf[3] = -0x409b62b1;
  iauBpn2xy((double (*) [3])idmsf,&eo,ppr);
  vvd(eo,0.001093465510215479,1e-12,"iauBpn2xy","x",&status);
  vvd(ppr[0],-4.281337229063151e-05,1e-12,"iauBpn2xy","y",&status);
  iauC2i00a(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999998323037166,1e-12,"iauC2i00a","11",&status);
  vvd((double)idmsf._8_8_,5.58152634899214e-10,1e-12,"iauC2i00a","12",&status);
  vvd(-0.00109356978534237,-0.0005791308477073444,1e-12,"iauC2i00a","13",&status);
  vvd(0.002516462370370876,-2.3842662278707524e-08,1e-12,"iauC2i00a","21",&status);
  vvd(0.9999968329010883,0.9999999991917405,1e-12,"iauC2i00a","22",&status);
  vvd(4.00615958735831e-05,-4.02059495502821e-05,1e-12,"iauC2i00a","23",&status);
  vvd(0.001093465510215479,0.0005791308472168153,1e-12,"iauC2i00a","31",&status);
  vvd(-4.281337229063151e-05,4.0205956615915e-05,1e-12,"iauC2i00a","32",&status);
  vvd(0.9999994012499173,0.9999998314954572,1e-12,"iauC2i00a","33",&status);
  iauC2i00b(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999998323040954,1e-12,"iauC2i00b","11",&status);
  vvd((double)idmsf._8_8_,5.581526349131824e-10,1e-12,"iauC2i00b","12",&status);
  vvd(-0.00109356978534237,-0.0005791301934855394,1e-12,"iauC2i00b","13",&status);
  vvd(0.002516462370370876,-2.3842392854991757e-08,1e-12,"iauC2i00b","21",&status);
  vvd(0.9999968329010883,0.9999999991917574,1e-12,"iauC2i00b","22",&status);
  vvd(4.00615958735831e-05,-4.02055297481903e-05,1e-12,"iauC2i00b","23",&status);
  vvd(0.001093465510215479,0.0005791301929950209,1e-12,"iauC2i00b","31",&status);
  vvd(-4.281337229063151e-05,4.0205536813737205e-05,1e-12,"iauC2i00b","32",&status);
  vvd(0.9999994012499173,0.999999831495853,1e-12,"iauC2i00b","33",&status);
  iauC2i06a(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999998323037159,1e-12,"iauC2i06a","11",&status);
  vvd((double)idmsf._8_8_,5.581121329587614e-10,1e-12,"iauC2i06a","12",&status);
  vvd(-0.00109356978534237,-0.000579130848774053,1e-12,"iauC2i06a","13",&status);
  vvd(0.002516462370370876,-2.3842531694523067e-08,1e-12,"iauC2i06a","21",&status);
  vvd(0.9999968329010883,0.9999999991917468,1e-12,"iauC2i06a","22",&status);
  vvd(4.00615958735831e-05,-4.020579392895682e-05,1e-12,"iauC2i06a","23",&status);
  vvd(0.001093465510215479,0.0005791308482835292,1e-12,"iauC2i06a","31",&status);
  vvd(-4.281337229063151e-05,4.0205800994540205e-05,1e-12,"iauC2i06a","32",&status);
  vvd(0.9999994012499173,0.9999998314954629,1e-12,"iauC2i06a","33",&status);
  idmsf[0] = 0x1b25a5b8;
  idmsf[1] = 0x3feffff8;
  idmsf[2] = 0x1ee795c7;
  idmsf[3] = -0x409b62b1;
  iauC2ibpn(2400000.5,50123.9999,(double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,0.999999402166409,1e-12,"iauC2ibpn","11",&status);
  vvd(dStack_1f0,-3.869195948017504e-09,1e-12,"iauC2ibpn","12",&status);
  vvd(local_1e8,-0.0010934655113832852,1e-12,"iauC2ibpn","13",&status);
  vvd(dStack_1e0,5.068413965715446e-08,1e-12,"iauC2ibpn","21",&status);
  vvd(local_1d8,0.9999999990835076,1e-12,"iauC2ibpn","22",&status);
  vvd(dStack_1d0,4.281334246452709e-05,1e-12,"iauC2ibpn","23",&status);
  vvd(local_1c8,0.001093465510215479,1e-12,"iauC2ibpn","31",&status);
  vvd(dStack_1c0,-4.281337229063151e-05,1e-12,"iauC2ibpn","32",&status);
  vvd(local_1b8,0.9999994012499173,1e-12,"iauC2ibpn","33",&status);
  iauC2ixy(2400000.5,53736.0,0.0005791308486706011,4.020579816732961e-05,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999998323037157,1e-12,"iauC2ixy","11",&status);
  vvd((double)idmsf._8_8_,5.581526349032241e-10,1e-12,"iauC2ixy","12",&status);
  vvd(-0.00109356978534237,-0.0005791308491611264,1e-12,"iauC2ixy","13",&status);
  vvd(0.002516462370370876,-2.384257057469843e-08,1e-12,"iauC2ixy","21",&status);
  vvd(0.9999968329010883,0.9999999991917469,1e-12,"iauC2ixy","22",&status);
  vvd(4.00615958735831e-05,-4.0205791101723245e-05,1e-12,"iauC2ixy","23",&status);
  vvd(0.001093465510215479,0.0005791308486706011,1e-12,"iauC2ixy","31",&status);
  vvd(-4.281337229063151e-05,4.020579816732961e-05,1e-12,"iauC2ixy","32",&status);
  vvd(0.9999994012499173,0.9999998314954628,1e-12,"iauC2ixy","33",&status);
  iauC2ixys(0.0005791308486706011,4.020579816732961e-05,-1.220040848472272e-08,(double (*) [3])idmsf
           );
  vvd((double)idmsf._0_8_,0.9999998323037157,1e-12,"iauC2ixys","11",&status);
  vvd((double)idmsf._8_8_,5.581984869168499e-10,1e-12,"iauC2ixys","12",&status);
  vvd(-0.00109356978534237,-0.0005791308491611282,1e-12,"iauC2ixys","13",&status);
  vvd(0.002516462370370876,-2.3842616426704402e-08,1e-12,"iauC2ixys","21",&status);
  vvd(0.9999968329010883,0.9999999991917469,1e-12,"iauC2ixys","22",&status);
  vvd(4.00615958735831e-05,-4.020579110169669e-05,1e-12,"iauC2ixys","23",&status);
  vvd(0.001093465510215479,0.0005791308486706011,1e-12,"iauC2ixys","31",&status);
  vvd(-4.281337229063151e-05,4.020579816732961e-05,1e-12,"iauC2ixys","32",&status);
  vvd(0.9999994012499173,0.9999998314954628,1e-12,"iauC2ixys","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40590000;
  idmsf[2] = 0;
  idmsf[3] = -0x3fb70000;
  iauC2s((double *)idmsf,&eo,ppr);
  vvd(eo,-0.4636476090008061,1e-14,"iauC2s","theta",&status);
  vvd(ppr[0],0.21998797739545944,1e-14,"iauC2s","phi",&status);
  iauC2t00a(2400000.5,53736.0,2400000.5,53736.0,2.55060238e-07,1.860359247e-06,(double (*) [3])idmsf
           );
  vvd((double)idmsf._0_8_,-0.18103321283071827,1e-12,"iauC2t00a","11",&status);
  vvd((double)idmsf._8_8_,0.9834769806938458,1e-12,"iauC2t00a","12",&status);
  vvd(25.0,6.555535638688342e-05,1e-12,"iauC2t00a","13",&status);
  vvd(0.002516462370370876,-0.9834768134135985,1e-12,"iauC2t00a","21",&status);
  vvd(0.9999968329010883,-0.18103322036495206,1e-12,"iauC2t00a","22",&status);
  vvd(4.00615958735831e-05,0.0005749801116141057,1e-12,"iauC2t00a","23",&status);
  vvd(0.001093465510215479,0.0005773474014081406,1e-12,"iauC2t00a","31",&status);
  vvd(-4.281337229063151e-05,3.9618323917701634e-05,1e-12,"iauC2t00a","32",&status);
  vvd(0.9999994012499173,0.9999998325501692,1e-12,"iauC2t00a","33",&status);
  iauC2t00b(2400000.5,53736.0,2400000.5,53736.0,2.55060238e-07,1.860359247e-06,(double (*) [3])idmsf
           );
  vvd((double)idmsf._0_8_,-0.1810332128439679,1e-12,"iauC2t00b","11",&status);
  vvd((double)idmsf._8_8_,0.9834769806913872,1e-12,"iauC2t00b","12",&status);
  vvd(25.0,6.555565082458416e-05,1e-12,"iauC2t00b","13",&status);
  vvd(0.002516462370370876,-0.9834768134115436,1e-12,"iauC2t00b","21",&status);
  vvd(0.9999968329010883,-0.1810332203784002,1e-12,"iauC2t00b","22",&status);
  vvd(4.00615958735831e-05,0.0005749793922030017,1e-12,"iauC2t00b","23",&status);
  vvd(0.001093465510215479,0.0005773467471863534,1e-12,"iauC2t00b","31",&status);
  vvd(-4.281337229063151e-05,3.961790411549945e-05,1e-12,"iauC2t00b","32",&status);
  vvd(0.9999994012499173,0.9999998325505636,1e-12,"iauC2t00b","33",&status);
  iauC2t06a(2400000.5,53736.0,2400000.5,53736.0,2.55060238e-07,1.860359247e-06,(double (*) [3])idmsf
           );
  vvd((double)idmsf._0_8_,-0.18103321283058973,1e-12,"iauC2t06a","11",&status);
  vvd((double)idmsf._8_8_,0.9834769806938592,1e-12,"iauC2t06a","12",&status);
  vvd(25.0,6.555550962998436e-05,1e-12,"iauC2t06a","13",&status);
  vvd(0.002516462370370876,-0.9834768134136215,1e-12,"iauC2t06a","21",&status);
  vvd(0.9999968329010883,-0.1810332203649131,1e-12,"iauC2t06a","22",&status);
  vvd(4.00615958735831e-05,0.0005749800844905594,1e-12,"iauC2t06a","23",&status);
  vvd(0.001093465510215479,0.0005773474024748546,1e-12,"iauC2t06a","31",&status);
  vvd(-4.281337229063151e-05,3.9618168296326906e-05,1e-12,"iauC2t06a","32",&status);
  vvd(0.9999994012499173,0.9999998325501748,1e-12,"iauC2t06a","33",&status);
  idmsf[0] = -0x5a080070;
  idmsf[1] = 0x3fefffff;
  idmsf[2] = -0x4a40000;
  idmsf[3] = 0x3e032d8f;
  eo = 0.9999999999999675;
  dStack_1f0 = -1.367174580728847e-11;
  local_1e8 = 2.5506023799999727e-07;
  dStack_1e0 = 1.4146249479570297e-11;
  local_1d8 = 0.9999999999982695;
  dStack_1d0 = -1.8603592469988663e-06;
  local_1c8 = -2.5506023797412153e-07;
  dStack_1c0 = 1.860359247002414e-06;
  local_1b8 = 0.999999999998237;
  iauC2tcio((double (*) [3])idmsf,1.75283325530307,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],-0.18103321283071105,1e-12,"iauC2tcio","11",&status);
  vvd(ppr[1],0.983476980693847,1e-12,"iauC2tcio","12",&status);
  vvd(ppr[2],6.555535638685467e-05,1e-12,"iauC2tcio","13",&status);
  vvd(0.00364365824,-0.9834768134135997,1e-12,"iauC2tcio","21",&status);
  vvd(-0.0154287319,-0.18103322036494485,1e-12,"iauC2tcio","22",&status);
  vvd(-0.00668922024,0.0005749801116141106,1e-12,"iauC2tcio","23",&status);
  vvd(local_318,0.0005773474014081407,1e-12,"iauC2tcio","31",&status);
  vvd(local_310,3.961832391772659e-05,1e-12,"iauC2tcio","32",&status);
  vvd(local_308,0.9999998325501692,1e-12,"iauC2tcio","33",&status);
  idmsf[0] = -0x36e8fdc9;
  idmsf[1] = 0x3feffffd;
  idmsf[2] = -0x1b443a37;
  idmsf[3] = -0x40aa297e;
  eo = 0.9999999999999675;
  dStack_1f0 = -1.367174580728847e-11;
  local_1e8 = 2.5506023799999727e-07;
  dStack_1e0 = 1.4146249479570297e-11;
  local_1d8 = 0.9999999999982695;
  dStack_1d0 = -1.8603592469988663e-06;
  local_1c8 = -2.5506023797412153e-07;
  dStack_1c0 = 1.860359247002414e-06;
  local_1b8 = 0.999999999998237;
  iauC2teqx((double (*) [3])idmsf,1.7541661380407305,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],-0.18103321285286858,1e-12,"iauC2teqx","11",&status);
  vvd(ppr[1],0.9834769806897685,1e-12,"iauC2teqx","12",&status);
  vvd(ppr[2],6.555535639982635e-05,1e-12,"iauC2teqx","13",&status);
  vvd(0.00364365824,-0.9834768134095211,1e-12,"iauC2teqx","21",&status);
  vvd(-0.0154287319,-0.18103322038710237,1e-12,"iauC2teqx","22",&status);
  vvd(-0.00668922024,0.0005749801116126439,1e-12,"iauC2teqx","23",&status);
  vvd(local_318,0.000577347401408154,1e-12,"iauC2teqx","31",&status);
  vvd(local_310,3.961832391768641e-05,1e-12,"iauC2teqx","32",&status);
  vvd(local_308,0.9999998325501692,1e-12,"iauC2teqx","33",&status);
  iauC2tpe(2400000.5,53736.0,2400000.5,53736.0,-9.630909107115582e-06,0.409078976335651,
           2.55060238e-07,1.860359247e-06,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,-0.18136779957630295,1e-12,"iauC2tpe","11",&status);
  vvd((double)idmsf._8_8_,0.9023482206891683,1e-12,"iauC2tpe","12",&status);
  vvd(-0.0005790767434730085,-0.39099029386410855,1e-12,"iauC2tpe","13",&status);
  vvd(0.0013328582543089545,-0.9834147641476805,1e-12,"iauC2tpe","21",&status);
  vvd(0.9999991109044506,-0.16598836354349952,1e-12,"iauC2tpe","22",&status);
  vvd(-4.097782710401556e-05,0.0730976389804282,1e-12,"iauC2tpe","23",&status);
  vvd(0.0005791308472168153,0.0010596854306732153,1e-12,"iauC2tpe","31",&status);
  vvd(4.0205956615939944e-05,0.3977631855605079,1e-12,"iauC2tpe","32",&status);
  vvd(0.9999998314954572,0.9174875068792735,1e-12,"iauC2tpe","33",&status);
  iauC2txy(2400000.5,53736.0,2400000.5,53736.0,0.0005791308486706011,4.020579816732961e-05,
           2.55060238e-07,1.860359247e-06,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,-0.18103321283062793,1e-12,"iauC2txy","11",&status);
  vvd((double)idmsf._8_8_,0.983476980693852,1e-12,"iauC2txy","12",&status);
  vvd(-0.0005790767434730085,6.555551248057666e-05,1e-12,"iauC2txy","13",&status);
  vvd(0.0013328582543089545,-0.9834768134136143,1e-12,"iauC2txy","21",&status);
  vvd(0.9999991109044506,-0.18103322036495292,1e-12,"iauC2txy","22",&status);
  vvd(-4.097782710401556e-05,0.000574980084359414,1e-12,"iauC2txy","23",&status);
  vvd(0.0005791308472168153,0.0005773474028619264,1e-12,"iauC2txy","31",&status);
  vvd(4.0205956615939944e-05,3.9618165469116246e-05,1e-12,"iauC2txy","32",&status);
  vvd(0.9999998314954572,0.9999998325501747,1e-12,"iauC2txy","33",&status);
  iVar2 = iauCal2jd(0x7d3,6,1,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2400000.5,0.0,"iauCal2jd","djm0",&status);
  vvd(eo,52791.0,0.0,"iauCal2jd","djm",&status);
  viv(iVar2,0,"iauCal2jd","j",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauCp((double *)idmsf,&eo);
  vvd(eo,0.3,0.0,"iauCp","1",&status);
  vvd(dStack_1f0,1.2,0.0,"iauCp","2",&status);
  vvd(local_1e8,-2.5,0.0,"iauCp","3",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauCpv((double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,0.3,0.0,"iauCpv","p1",&status);
  vvd(dStack_1f0,1.2,0.0,"iauCpv","p2",&status);
  vvd(local_1e8,-2.5,0.0,"iauCpv","p3",&status);
  vvd(dStack_1e0,-0.5,0.0,"iauCpv","v1",&status);
  vvd(local_1d8,3.1,0.0,"iauCpv","v2",&status);
  vvd(dStack_1d0,0.9,0.0,"iauCpv","v3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauCr((double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,2.0,0.0,"iauCr","11",&status);
  vvd(dStack_1f0,3.0,0.0,"iauCr","12",&status);
  vvd(local_1e8,2.0,0.0,"iauCr","13",&status);
  vvd(dStack_1e0,3.0,0.0,"iauCr","21",&status);
  vvd(local_1d8,2.0,0.0,"iauCr","22",&status);
  vvd(dStack_1d0,3.0,0.0,"iauCr","23",&status);
  vvd(local_1c8,3.0,0.0,"iauCr","31",&status);
  vvd(dStack_1c0,4.0,0.0,"iauCr","32",&status);
  vvd(local_1b8,5.0,0.0,"iauCr","33",&status);
  iVar2 = iauD2dtf("UTC",5,2400000.5,49533.99999,(int *)&eo,(int *)ppr,(int *)&da_1,idmsf);
  viv(eo._0_4_,0x7ca,"iauD2dtf","y",&status);
  viv(ppr[0]._0_4_,6,"iauD2dtf","mo",&status);
  viv(da_1._0_4_,0x1e,"iauD2dtf","d",&status);
  viv(idmsf[0],0x17,"iauD2dtf","h",&status);
  viv(idmsf[1],0x3b,"iauD2dtf","m",&status);
  viv(idmsf[2],0x3c,"iauD2dtf","s",&status);
  viv(idmsf[3],0x351f,"iauD2dtf","f",&status);
  viv(iVar2,0,"iauD2dtf","j",&status);
  iauD2tf(4,-0.987654321,(char *)&eo,idmsf);
  viv((int)eo._0_1_,0x2d,"iauD2tf","s",&status);
  viv(idmsf[0],0x17,"iauD2tf","0",&status);
  viv(idmsf[1],0x2a,"iauD2tf","1",&status);
  viv(idmsf[2],0xd,"iauD2tf","2",&status);
  viv(idmsf[3],0xd05,"iauD2tf","3",&status);
  iVar2 = iauDat(0x7d3,6,1,0.0,(double *)idmsf);
  vvd((double)idmsf._0_8_,32.0,0.0,"iauDat","d1",&status);
  viv(iVar2,0,"iauDat","j1",&status);
  iVar2 = iauDat(0x7d8,1,0x11,0.0,(double *)idmsf);
  vvd((double)idmsf._0_8_,33.0,0.0,"iauDat","d2",&status);
  viv(iVar2,0,"iauDat","j2",&status);
  iVar2 = iauDat(0x7e1,9,1,0.0,(double *)idmsf);
  vvd((double)idmsf._0_8_,37.0,0.0,"iauDat","d3",&status);
  viv(iVar2,0,"iauDat","j3",&status);
  dVar1 = iauDtdb(2448939.5,0.123,0.76543,5.0123,5525.242,3190.0);
  vvd(dVar1,-0.001280368005936999,1e-15,"iauDtdb","",&status);
  iVar2 = iauDtf2d("UTC",0x7ca,6,0x1e,0x17,0x3b,60.13599,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_ + eo,2449534.49999,1e-06,"iauDtf2d","u",&status);
  viv(iVar2,0,"iauDtf2d","j",&status);
  iauEceq06(2456165.5,0.401182685,5.1,-0.9,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,5.533459733613628,1e-14,"iauEceq06","dr",&status);
  vvd(eo,-1.2465429325544806,1e-14,"iauEceq06","dd",&status);
  iauEcm06(2456165.5,0.401182685,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999952427708702,1e-14,"iauEcm06","rm11",&status);
  vvd((double)idmsf._8_8_,-0.0028290620576630426,1e-14,"iauEcm06","rm12",&status);
  vvd(2.0,-0.0012291637411000176,1e-14,"iauEcm06","rm13",&status);
  vvd(3.0,0.0030845468769086534,1e-14,"iauEcm06","rm21",&status);
  vvd(2.0,0.9174891871550392,1e-14,"iauEcm06","rm22",&status);
  vvd(3.0,0.3977487611849338,1e-14,"iauEcm06","rm23",&status);
  vvd(3.0,2.488512951527406e-06,1e-14,"iauEcm06","rm31",&status);
  vvd(4.0,-0.39775066041611956,1e-14,"iauEcm06","rm32",&status);
  vvd(5.0,0.9174935488232863,1e-14,"iauEcm06","rm33",&status);
  dVar1 = iauEe00(2400000.5,53736.0,0.409078976335651,-9.630909107115582e-06);
  vvd(dVar1,-8.834193235367966e-06,1e-18,"iauEe00","",&status);
  dVar1 = iauEe00a(2400000.5,53736.0);
  vvd(dVar1,-8.834192459222587e-06,1e-18,"iauEe00a","",&status);
  dVar1 = iauEe00b(2400000.5,53736.0);
  vvd(dVar1,-8.835700060003032e-06,1e-18,"iauEe00b","",&status);
  dVar1 = iauEe06a(2400000.5,53736.0);
  vvd(dVar1,-8.83419507204379e-06,1e-15,"iauEe06a","",&status);
  dVar1 = iauEect00(2400000.5,53736.0);
  vvd(dVar1,2.046085004885125e-09,1e-20,"iauEect00","",&status);
  iVar2 = iauEform(0,(double *)idmsf,&eo);
  viv(iVar2,-1,"iauEform","j0",&status);
  iVar2 = iauEform(1,(double *)idmsf,&eo);
  viv(iVar2,0,"iauEform","j1",&status);
  vvd((double)idmsf._0_8_,6378137.0,1e-10,"iauEform","a1",&status);
  vvd(eo,0.003352810664747481,1e-18,"iauEform","f1",&status);
  iVar2 = iauEform(2,(double *)idmsf,&eo);
  viv(iVar2,0,"iauEform","j2",&status);
  vvd((double)idmsf._0_8_,6378137.0,1e-10,"iauEform","a2",&status);
  vvd(eo,0.003352810681182319,1e-18,"iauEform","f2",&status);
  iVar2 = iauEform(3,(double *)idmsf,&eo);
  viv(iVar2,0,"iauEform","j2",&status);
  vvd((double)idmsf._0_8_,6378135.0,1e-10,"iauEform","a3",&status);
  vvd(eo,0.003352779454167505,1e-18,"iauEform","f3",&status);
  iVar2 = iauEform(4,(double *)idmsf,&eo);
  viv(iVar2,-1,"iauEform","j3",&status);
  dVar1 = iauEo06a(2400000.5,53736.0);
  vvd(dVar1,-0.0013328823719418337,1e-15,"iauEo06a","",&status);
  idmsf[0] = -0x36e8fdc9;
  idmsf[1] = 0x3feffffd;
  idmsf[2] = -0x1b443a37;
  idmsf[3] = -0x40aa297e;
  dVar1 = iauEors((double (*) [3])idmsf,-1.220040848472272e-08);
  vvd(dVar1,-0.0013328827151307446,1e-14,"iauEors","",&status);
  dVar1 = iauEpb(2415019.8135,30103.18648);
  vvd(dVar1,1982.4184241592786,1e-12,"iauEpb","",&status);
  iauEpb2jd(1957.3,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2400000.5,1e-09,"iauEpb2jd","djm0",&status);
  vvd(eo,35948.1915101513,1e-09,"iauEpb2jd","mjd",&status);
  dVar1 = iauEpj(2451545.0,-7392.5);
  vvd(dVar1,1979.7604380561258,1e-12,"iauEpj","",&status);
  iauEpj2jd(1996.8,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2400000.5,1e-09,"iauEpj2jd","djm0",&status);
  vvd(eo,50375.7,1e-09,"iauEpj2jd","mjd",&status);
  iVar2 = iauEpv00(2400000.5,53411.52501161,(double (*) [3])idmsf,(double (*) [3])&eo);
  vvd((double)idmsf._0_8_,-0.7757238809297706,1e-14,"iauEpv00","ph(x)",&status);
  vvd((double)idmsf._8_8_,0.559805224136334,1e-14,"iauEpv00","ph(y)",&status);
  vvd(-0.0005790767434730085,0.2426998466481687,1e-14,"iauEpv00","ph(z)",&status);
  vvd(0.0013328582543089545,-0.010918918241473138,1e-15,"iauEpv00","vh(x)",&status);
  vvd(0.9999991109044506,-0.01247187268440845,1e-15,"iauEpv00","vh(y)",&status);
  vvd(-4.097782710401556e-05,-0.005407569418065039,1e-15,"iauEpv00","vh(z)",&status);
  vvd(eo,-0.7714104440491112,1e-14,"iauEpv00","pb(x)",&status);
  vvd(dStack_1f0,0.5598412061824172,1e-14,"iauEpv00","pb(y)",&status);
  vvd(local_1e8,0.24259962777224525,1e-14,"iauEpv00","pb(z)",&status);
  vvd(dStack_1e0,-0.010918742681168233,1e-15,"iauEpv00","vb(x)",&status);
  vvd(local_1d8,-0.012465254617328616,1e-15,"iauEpv00","vb(y)",&status);
  vvd(dStack_1d0,-0.0054047731809662315,1e-15,"iauEpv00","vb(z)",&status);
  viv(iVar2,0,"iauEpv00","j",&status);
  iauEqec06(1234.5,2440000.5,1.234,0.987,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,1.3425099189946545,1e-14,"iauEqec06","dl",&status);
  vvd(eo,0.5926215259704608,1e-14,"iauEqec06","db",&status);
  dVar1 = iauEqeq94(2400000.5,41234.0);
  vvd(dVar1,5.357758254609257e-05,1e-17,"iauEqeq94","",&status);
  dVar1 = iauEra00(2400000.5,54388.0);
  vvd(dVar1,0.4022837240028158,1e-12,"iauEra00","",&status);
  dVar1 = iauFad03(0.8);
  vvd(dVar1,1.9467092053969257,1e-12,"iauFad03","",&status);
  dVar1 = iauFae03(0.8);
  vvd(dVar1,1.7447137389130818,1e-12,"iauFae03","",&status);
  dVar1 = iauFaf03(0.8);
  vvd(dVar1,0.25977113667454993,1e-12,"iauFaf03","",&status);
  dVar1 = iauFaju03(0.8);
  vvd(dVar1,5.275711665202481,1e-12,"iauFaju03","",&status);
  dVar1 = iauFal03(0.8);
  vvd(dVar1,5.132369751108684,1e-12,"iauFal03","",&status);
  dVar1 = iauFalp03(0.8);
  vvd(dVar1,6.226797973505508,1e-12,"iauFalp03","",&status);
  dVar1 = iauFama03(0.8);
  vvd(dVar1,3.2755068402777816,1e-12,"iauFama03","",&status);
  dVar1 = iauFame03(0.8);
  vvd(dVar1,5.417338184297289,1e-12,"iauFame03","",&status);
  dVar1 = iauFane03(0.8);
  vvd(dVar1,2.0793438308604135,1e-12,"iauFane03","",&status);
  dVar1 = iauFaom03(0.8);
  vvd(dVar1,-5.973618440951302,1e-12,"iauFaom03","",&status);
  dVar1 = iauFapa03(0.8);
  vvd(dVar1,0.0195088476224,1e-12,"iauFapa03","",&status);
  dVar1 = iauFasa03(0.8);
  vvd(dVar1,5.371574539440827,1e-12,"iauFasa03","",&status);
  dVar1 = iauFaur03(0.8);
  vvd(dVar1,5.180636450180414,1e-12,"iauFaur03","",&status);
  dVar1 = iauFave03(0.8);
  vvd(dVar1,3.424900460533758,1e-12,"iauFave03","",&status);
  iauFk425(0.07626899753879587,-1.1374053783996059,1.9737492178490876e-05,5.659714913272723e-06,
           0.134,8.7,(double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,0.08757989933556445,1e-14,"iauFk425","r2000",&status);
  vvd(eo,-1.132279113042092,1e-12,"iauFk425","d2000",&status);
  vvd(ppr[0],1.953670614474396e-05,1e-17,"iauFk425","dr2000",&status);
  vvd(da_1,5.63768667865964e-06,1e-18,"iauFk425","dd2000",&status);
  vvd(di_2,0.13399199505827677,1e-13,"iauFk425","p2000",&status);
  vvd(rob_1,8.736999669183529,1e-12,"iauFk425","v2000",&status);
  iauFk45z(0.01602284975382961,-0.1164347929099906,1954.6776176252567,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.027192959116068623,1e-15,"iauFk45z","r2000",&status);
  vvd(eo,-0.1115766001565927,1e-13,"iauFk45z","d2000",&status);
  iauFk524(0.8723503576487276,-0.7517076365138887,2.0194477554304722e-05,3.5415639405051605e-06,
           0.1559,86.87,(double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,0.8636359659799604,1e-13,"iauFk524","r1950",&status);
  vvd(eo,-0.7550281733160843,1e-13,"iauFk524","d1950",&status);
  vvd(ppr[0],2.0236281927471725e-05,1e-17,"iauFk524","dr1950",&status);
  vvd(da_1,3.6244597549353345e-06,1e-18,"iauFk524","dd1950",&status);
  vvd(di_2,0.15600799632993903,1e-13,"iauFk524","p1950",&status);
  vvd(rob_1,86.79606353469164,1e-11,"iauFk524","v1950",&status);
  iauFk52h(1.76779433,-0.2917517103,-1.91851572e-07,-5.8468475e-06,0.37921,-7.6,(double *)idmsf,&eo,
           ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,1.7677942262999475,1e-14,"iauFk52h","ra",&status);
  vvd(eo,-0.29175160705303915,1e-14,"iauFk52h","dec",&status);
  vvd(ppr[0],-1.9618741256057212e-07,1e-19,"iauFk52h","dr5",&status);
  vvd(da_1,-5.845990517669391e-06,1e-19,"iauFk52h","dd5",&status);
  vvd(di_2,0.37921,1e-14,"iauFk52h","px",&status);
  vvd(rob_1,-7.600000094000025,1e-11,"iauFk52h","rv",&status);
  iauFk54z(0.02719026625066316,-0.11158151707387548,1954.6773081603164,(double *)idmsf,&eo,ppr,&da_1
          );
  vvd((double)idmsf._0_8_,0.016020155883900655,1e-14,"iauFk54z","r1950",&status);
  vvd(eo,-0.11643971011107654,1e-13,"iauFk54z","d1950",&status);
  vvd(ppr[0],-1.1757126484710908e-08,1e-20,"iauFk54z","dr1950",&status);
  vvd(da_1,2.108109051316431e-08,1e-20,"iauFk54z","dd1950",&status);
  iauFk5hip((double (*) [3])idmsf,&eo);
  vvd((double)idmsf._0_8_,0.9999999999999929,1e-14,"iauFk5hip","11",&status);
  vvd((double)idmsf._8_8_,1.1102233510229197e-07,1e-17,"iauFk5hip","12",&status);
  vvd(-0.0005790767434730085,4.4118039625365584e-08,1e-17,"iauFk5hip","13",&status);
  vvd(0.0013328582543089545,-1.1102233084587465e-07,1e-17,"iauFk5hip","21",&status);
  vvd(0.9999991109044506,0.9999999999999892,1e-14,"iauFk5hip","22",&status);
  vvd(-4.097782710401556e-05,-9.647792498984142e-08,1e-17,"iauFk5hip","23",&status);
  vvd(0.0005791308472168153,-4.411805033656962e-08,1e-17,"iauFk5hip","31",&status);
  vvd(4.0205956615939944e-05,9.647792009175315e-08,1e-17,"iauFk5hip","32",&status);
  vvd(0.9999998314954572,0.9999999999999943,1e-14,"iauFk5hip","33",&status);
  vvd(eo,-1.454441043328608e-09,1e-17,"iauFk5hip","s1",&status);
  vvd(dStack_1f0,2.908882086657216e-09,1e-17,"iauFk5hip","s2",&status);
  vvd(local_1e8,3.393695767766752e-09,1e-17,"iauFk5hip","s3",&status);
  iauFk5hz(1.76779433,-0.2917517103,2400000.5,54479.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,1.767794191464424,1e-12,"iauFk5hz","ra",&status);
  vvd(eo,-0.29175160016798846,1e-12,"iauFk5hz","dec",&status);
  iauFw2m(-2.2433876709979924e-06,0.4091014602391313,-0.0009501954178013015,0.40910143165873675,
          (double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995505176007,1e-12,"iauFw2m","11",&status);
  vvd((double)idmsf._8_8_,0.0008695404617348192,1e-12,"iauFw2m","12",&status);
  vvd(-0.0005790767434730085,0.00037797352018655825,1e-12,"iauFw2m","13",&status);
  vvd(0.0013328582543089545,-0.0008695404723772016,1e-12,"iauFw2m","21",&status);
  vvd(0.9999991109044506,0.9999996219496027,1e-12,"iauFw2m","22",&status);
  vvd(-4.097782710401556e-05,-1.3617524968871e-07,1e-12,"iauFw2m","23",&status);
  vvd(0.0005791308472168153,-0.00037797349570340826,1e-12,"iauFw2m","31",&status);
  vvd(4.0205956615939944e-05,-1.9248808480876157e-07,1e-12,"iauFw2m","32",&status);
  vvd(0.9999998314954572,0.9999999285679972,1e-12,"iauFw2m","33",&status);
  iauFw2xy(-2.2433876709979924e-06,0.4091014602391313,-0.0009501954178013015,0.40910143165873675,
           (double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-0.00037797349570340826,1e-14,"iauFw2xy","x",&status);
  vvd(eo,-1.9248808480876157e-07,1e-14,"iauFw2xy","y",&status);
  iauG2icrs(5.585053606381854,-0.7853981633974483,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,5.933807430222719,1e-14,"iauG2icrs","R",&status);
  vvd(eo,-1.1784870613579945,1e-14,"iauG2icrs","D",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x413e8480;
  idmsf[2] = 0;
  idmsf[3] = 0x4146e360;
  iVar2 = iauGc2gd(0,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,-1,"iauGc2gd","j0",&status);
  iVar2 = iauGc2gd(1,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,0,"iauGc2gd","j1",&status);
  vvd(eo,0.982793723247329,1e-14,"iauGc2gd","e1",&status);
  vvd(ppr[0],0.9716018481907546,1e-14,"iauGc2gd","p1",&status);
  vvd(da_1,331.41724614260596,1e-08,"iauGc2gd","h1",&status);
  iVar2 = iauGc2gd(2,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,0,"iauGc2gd","j2",&status);
  vvd(eo,0.982793723247329,1e-14,"iauGc2gd","e2",&status);
  vvd(ppr[0],0.9716018482060785,1e-14,"iauGc2gd","p2",&status);
  vvd(da_1,331.41731754844346,1e-08,"iauGc2gd","h2",&status);
  iVar2 = iauGc2gd(3,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,0,"iauGc2gd","j3",&status);
  vvd(eo,0.982793723247329,1e-14,"iauGc2gd","e3",&status);
  vvd(ppr[0],0.9716018181101512,1e-14,"iauGc2gd","p3",&status);
  vvd(da_1,333.2770726130318,1e-08,"iauGc2gd","h3",&status);
  iVar2 = iauGc2gd(4,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,-1,"iauGc2gd","j4",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x413e8480;
  idmsf[2] = 0;
  idmsf[3] = 0x4146e360;
  iVar2 = iauGc2gde(6378136.0,0.0033528,(double *)idmsf,&eo,ppr,&da_1);
  viv(iVar2,0,"iauGc2gde","j",&status);
  vvd(eo,0.982793723247329,1e-14,"iauGc2gde","e",&status);
  vvd(ppr[0],0.9716018377570411,1e-14,"iauGc2gde","p",&status);
  vvd(da_1,332.368624957644,1e-08,"iauGc2gde","h",&status);
  iVar2 = iauGd2gc(0,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,-1,"iauGd2gc","j0",&status);
  iVar2 = iauGd2gc(1,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,0,"iauGd2gc","j1",&status);
  vvd((double)idmsf._0_8_,-5599000.557704994,1e-07,"iauGd2gc","1/1",&status);
  vvd((double)idmsf._8_8_,233011.67223479203,1e-07,"iauGd2gc","2/1",&status);
  vvd(5244000.0,-3040909.470698336,1e-07,"iauGd2gc","3/1",&status);
  iVar2 = iauGd2gc(2,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,0,"iauGd2gc","j2",&status);
  vvd((double)idmsf._0_8_,-5599000.557726098,1e-07,"iauGd2gc","1/2",&status);
  vvd((double)idmsf._8_8_,233011.6722356703,1e-07,"iauGd2gc","2/2",&status);
  vvd(5244000.0,-3040909.4706095476,1e-07,"iauGd2gc","3/2",&status);
  iVar2 = iauGd2gc(3,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,0,"iauGd2gc","j3",&status);
  vvd((double)idmsf._0_8_,-5598998.762630149,1e-07,"iauGd2gc","1/3",&status);
  vvd((double)idmsf._8_8_,233011.59752978222,1e-07,"iauGd2gc","2/3",&status);
  vvd(5244000.0,-3040908.686146711,1e-07,"iauGd2gc","3/3",&status);
  iVar2 = iauGd2gc(4,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,-1,"iauGd2gc","j4",&status);
  iVar2 = iauGd2gce(6378136.0,0.0033528,3.1,-0.5,2500.0,(double *)idmsf);
  viv(iVar2,0,"iauGd2gce","j",&status);
  vvd((double)idmsf._0_8_,-5598999.6665116325,1e-07,"iauGd2gce","1",&status);
  vvd((double)idmsf._8_8_,233011.63514630572,1e-07,"iauGd2gce","2",&status);
  vvd(5244000.0,-3040909.051731413,1e-07,"iauGd2gce","3",&status);
  dVar1 = iauGmst00(2400000.5,53736.0,2400000.5,53736.0);
  vvd(dVar1,1.7541749722107407,1e-12,"iauGmst00","",&status);
  dVar1 = iauGmst06(2400000.5,53736.0,2400000.5,53736.0);
  vvd(dVar1,1.7541749718700912,1e-12,"iauGmst06","",&status);
  dVar1 = iauGmst82(2400000.5,53736.0);
  vvd(dVar1,1.754174981860675,1e-12,"iauGmst82","",&status);
  dVar1 = iauGst00a(2400000.5,53736.0,2400000.5,53736.0);
  vvd(dVar1,1.7541661380182814,1e-12,"iauGst00a","",&status);
  dVar1 = iauGst00b(2400000.5,53736.0);
  vvd(dVar1,1.7541661365106807,1e-12,"iauGst00b","",&status);
  idmsf[0] = -0x36e8fdc9;
  idmsf[1] = 0x3feffffd;
  idmsf[2] = -0x1b443a37;
  idmsf[3] = -0x40aa297e;
  dVar1 = iauGst06(2400000.5,53736.0,2400000.5,53736.0,(double (*) [3])idmsf);
  vvd(dVar1,1.7541661380181677,1e-12,"iauGst06","",&status);
  dVar1 = iauGst06a(2400000.5,53736.0,2400000.5,53736.0);
  vvd(dVar1,1.754166137675019,1e-12,"iauGst06a","",&status);
  dVar1 = iauGst94(2400000.5,53736.0);
  vvd(dVar1,1.7541661360206453,1e-12,"iauGst94","",&status);
  iauH2fk5(1.767794352,-0.2917512594,-2.76413026e-06,-5.92994449e-06,0.37921,-7.6,(double *)idmsf,
           &eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,1.7677944557000655,1e-13,"iauH2fk5","ra",&status);
  vvd(eo,-0.2917513626469639,1e-13,"iauH2fk5","dec",&status);
  vvd(ppr[0],-2.7597945024511204e-06,1e-18,"iauH2fk5","dr5",&status);
  vvd(da_1,-5.930801409326283e-06,1e-18,"iauH2fk5","dd5",&status);
  vvd(di_2,0.37921,1e-13,"iauH2fk5","px",&status);
  vvd(rob_1,-7.600000130907112,1e-11,"iauH2fk5","rv",&status);
  iauHd2ae(1.1,1.2,0.3,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,5.916889243730066,1e-13,"iauHd2ae","a",&status);
  vvd(eo,0.44721863049904864,1e-14,"iauHd2ae","e",&status);
  dVar1 = iauHd2pa(1.1,1.2,0.3);
  vvd(dVar1,1.9062274280019955,1e-13,"iauHd2pa","q",&status);
  iauHfk5z(1.767794352,-0.2917512594,2400000.5,54479.0,(double *)idmsf,&eo,ppr,&da_1);
  vvd((double)idmsf._0_8_,1.7677944905355811,1e-13,"iauHfk5z","ra",&status);
  vvd(eo,-0.2917513695320114,1e-14,"iauHfk5z","dec",&status);
  vvd(ppr[0],4.335890983539243e-09,1e-22,"iauHfk5z","dr5",&status);
  vvd(da_1,-8.569648841237746e-10,1e-23,"iauHfk5z","dd5",&status);
  iauIcrs2g(5.933807430222719,-1.1784870613579945,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,5.585053606381854,1e-14,"iauIcrs2g","L",&status);
  vvd(eo,-0.7853981633974483,1e-14,"iauIcrs2g","B",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauIr((double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,1.0,0.0,"iauIr","11",&status);
  vvd((double)idmsf._8_8_,0.0,0.0,"iauIr","12",&status);
  vvd(2.0,0.0,0.0,"iauIr","13",&status);
  vvd(3.0,0.0,0.0,"iauIr","21",&status);
  vvd(2.0,1.0,0.0,"iauIr","22",&status);
  vvd(3.0,0.0,0.0,"iauIr","23",&status);
  vvd(3.0,0.0,0.0,"iauIr","31",&status);
  vvd(4.0,0.0,0.0,"iauIr","32",&status);
  vvd(5.0,1.0,0.0,"iauIr","33",&status);
  iVar2 = iauJd2cal(2400000.5,50123.9999,(int *)&eo,(int *)ppr,(int *)&da_1,(double *)idmsf);
  viv(eo._0_4_,0x7cc,"iauJd2cal","y",&status);
  viv(ppr[0]._0_4_,2,"iauJd2cal","m",&status);
  viv(da_1._0_4_,10,"iauJd2cal","d",&status);
  vvd((double)idmsf._0_8_,0.9999,1e-07,"iauJd2cal","fd",&status);
  viv(iVar2,0,"iauJd2cal","j",&status);
  iVar2 = iauJdcalf(4,2400000.5,50123.9999,idmsf);
  viv(idmsf[0],0x7cc,"iauJdcalf","y",&status);
  viv(idmsf[1],2,"iauJdcalf","m",&status);
  viv(idmsf[2],10,"iauJdcalf","d",&status);
  viv(idmsf[3],9999,"iauJdcalf","f",&status);
  viv(iVar2,0,"iauJdcalf","j",&status);
  idmsf[0] = 0x53213a37;
  idmsf[1] = -0x4017933e;
  idmsf[2] = -0x7a6fcc85;
  idmsf[3] = -0x401c8613;
  eo = -0.763276255;
  dStack_1f0 = -0.608633767;
  local_1e8 = -0.216735543;
  ppr[0] = 0.76700421;
  ppr[1] = 0.605629598;
  ppr[2] = 0.211937094;
  iauLd(0.00028574,(double *)idmsf,&eo,ppr,8.91276983,3e-10,&da_1);
  vvd(da_1,-0.7632762548968159,1e-12,"iauLd","1",&status);
  vvd(dStack_120,-0.6086337670823763,1e-12,"iauLd","2",&status);
  vvd(local_118,-0.2167355431320547,1e-12,"iauLd","3",&status);
  idmsf[0] = -0xb7ab279;
  idmsf[1] = 0x3f32b9eb;
  idmsf[2] = -0x1c9e31b4;
  idmsf[3] = 0x3df49da7;
  eo = -0.974170437;
  dStack_1f0 = -0.2115201;
  local_1e8 = -0.0917583114;
  ppr[0] = -0.763276255;
  ppr[1] = -0.608633767;
  ppr[2] = -0.216735543;
  iauLdn(3,(iauLDBODY *)idmsf,&eo,ppr,&da_1);
  vvd(da_1,-0.7632762579693334,1e-12,"iauLdn","1",&status);
  vvd(dStack_120,-0.6086337636093002,1e-12,"iauLdn","2",&status);
  vvd(local_118,-0.2167355420646328,1e-12,"iauLdn","3",&status);
  idmsf[0] = 0x53213a37;
  idmsf[1] = -0x4017933e;
  idmsf[2] = -0x7a6fcc85;
  idmsf[3] = -0x401c8613;
  eo = -0.973644023;
  dStack_1f0 = -0.20925523;
  local_1e8 = -0.0907169552;
  iauLdsun((double *)idmsf,&eo,0.999809214,ppr);
  vvd(ppr[0],-0.7632762580731414,1e-12,"iauLdsun","1",&status);
  vvd(ppr[1],-0.6086337635262647,1e-12,"iauLdsun","2",&status);
  vvd(ppr[2],-0.21673554193223213,1e-12,"iauLdsun","3",&status);
  iauLteceq(2500.0,1.5,0.6,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,1.2751560218619211,1e-14,"iauLteceq","dr",&status);
  vvd(eo,0.9966573543519205,1e-14,"iauLteceq","dd",&status);
  iauLtecm(-3000.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.3564105644859789,1e-14,"iauLtecm","rm11",&status);
  vvd((double)idmsf._8_8_,0.8530575738617683,1e-14,"iauLtecm","rm12",&status);
  vvd(-0.216735543,0.381135520779506,1e-14,"iauLtecm","rm13",&status);
  vvd(-5.60956681,-0.934328346964071,1e-14,"iauLtecm","rm21",&status);
  vvd(-1.98079819,0.3247830597681746,1e-14,"iauLtecm","rm22",&status);
  vvd(0.0030723249,0.14678727515359408,1e-14,"iauLtecm","rm23",&status);
  vvd(-0.00406995477,0.0014316361912011678,1e-14,"iauLtecm","rm31",&status);
  vvd(-0.00181335842,-0.4084222566960599,1e-14,"iauLtecm","rm32",&status);
  vvd(0.00095435,0.9127919865189031,1e-14,"iauLtecm","rm33",&status);
  iauLteqec(-1500.0,1.234,0.987,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.5039483649047115,1e-14,"iauLteqec","dl",&status);
  vvd(eo,0.5848534459726225,1e-14,"iauLteqec","db",&status);
  iauLtp(1666.666,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9967044141159214,1e-14,"iauLtp","rp11",&status);
  vvd((double)idmsf._8_8_,0.0743780189319321,1e-14,"iauLtp","rp12",&status);
  vvd(-0.216735543,0.03237624409345603,1e-14,"iauLtp","rp13",&status);
  vvd(-5.60956681,-0.07437802731819618,1e-14,"iauLtp","rp21",&status);
  vvd(-1.98079819,0.9972293894454534,1e-14,"iauLtp","rp22",&status);
  vvd(0.0030723249,-0.0012057688427235932,1e-14,"iauLtp","rp23",&status);
  vvd(-0.00406995477,-0.03237622482766576,1e-14,"iauLtp","rp31",&status);
  vvd(-0.00181335842,-0.001206286039697609,1e-14,"iauLtp","rp32",&status);
  vvd(0.00095435,0.9994750246704011,1e-14,"iauLtp","rp33",&status);
  iauLtpb(1666.666,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9967044167723272,1e-14,"iauLtpb","rpb11",&status);
  vvd((double)idmsf._8_8_,0.0743779473120334,1e-14,"iauLtpb","rpb12",&status);
  vvd(-0.216735543,0.03237632684841626,1e-14,"iauLtpb","rpb13",&status);
  vvd(-5.60956681,-0.07437795663437177,1e-14,"iauLtpb","rpb21",&status);
  vvd(-1.98079819,0.9972293947500014,1e-14,"iauLtpb","rpb22",&status);
  vvd(0.0030723249,-0.0012057418659112433,1e-14,"iauLtpb","rpb23",&status);
  vvd(-0.00406995477,-0.03237630543224665,1e-14,"iauLtpb","rpb31",&status);
  vvd(-0.00181335842,-0.0012063167910764854,1e-14,"iauLtpb","rpb32",&status);
  vvd(0.00095435,0.9994750220222439,1e-14,"iauLtpb","rpb33",&status);
  iauLtpecl(-1500.0,(double *)idmsf);
  vvd((double)idmsf._0_8_,0.00047686256764770964,1e-14,"iauLtpecl","vec1",&status);
  vvd((double)idmsf._8_8_,-0.40522595330918754,1e-14,"iauLtpecl","vec2",&status);
  vvd(-0.216735543,0.9142164401096448,1e-14,"iauLtpecl","vec3",&status);
  iauLtpequ(-2500.0,(double *)idmsf);
  vvd((double)idmsf._0_8_,-0.35866525602373267,1e-14,"iauLtpequ","veq1",&status);
  vvd((double)idmsf._8_8_,-0.19969789107711286,1e-14,"iauLtpequ","veq2",&status);
  vvd(-0.216735543,0.911855244225082,1e-14,"iauLtpequ","veq3",&status);
  iauMoon98(2400000.5,43999.9,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,-0.002601295959971044,1e-11,"iauMoon98","x 4",&status);
  vvd((double)idmsf._8_8_,0.0006139750944302743,1e-11,"iauMoon98","y 4",&status);
  vvd(-0.216735543,0.0002640794528229829,1e-11,"iauMoon98","z 4",&status);
  vvd(-5.60956681,-0.0001244321506649895,1e-11,"iauMoon98","xd 4",&status);
  vvd(-1.98079819,-0.0005219076942678119,1e-11,"iauMoon98","yd 4",&status);
  vvd(0.0030723249,-0.0001716132214378462,1e-11,"iauMoon98","zd 4",&status);
  iauNum00a(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999999999536228,1e-12,"iauNum00a","11",&status);
  vvd((double)idmsf._8_8_,8.836238544090872e-06,1e-12,"iauNum00a","12",&status);
  vvd(-0.216735543,3.830835237722401e-06,1e-12,"iauNum00a","13",&status);
  vvd(-5.60956681,-8.83608288079857e-06,1e-12,"iauNum00a","21",&status);
  vvd(-1.98079819,0.9999999991354656,1e-12,"iauNum00a","22",&status);
  vvd(0.0030723249,-4.0632408653625e-05,1e-12,"iauNum00a","23",&status);
  vvd(-0.00406995477,-3.831194272065996e-06,1e-12,"iauNum00a","31",&status);
  vvd(-0.00181335842,4.063237480216292e-05,1e-12,"iauNum00a","32",&status);
  vvd(0.00095435,0.9999999991671661,1e-12,"iauNum00a","33",&status);
  iauNum00b(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.999999999953607,1e-12,"iauNum00b","11",&status);
  vvd((double)idmsf._8_8_,8.837746144871248e-06,1e-12,"iauNum00b","12",&status);
  vvd(-0.216735543,3.831488838252203e-06,1e-12,"iauNum00b","13",&status);
  vvd(-5.60956681,-8.837590456632305e-06,1e-12,"iauNum00b","21",&status);
  vvd(-1.98079819,0.9999999991354692,1e-12,"iauNum00b","22",&status);
  vvd(0.0030723249,-4.0631987985595914e-05,1e-12,"iauNum00b","23",&status);
  vvd(-0.00406995477,-3.831847930134941e-06,1e-12,"iauNum00b","31",&status);
  vvd(-0.00181335842,4.063195412258168e-05,1e-12,"iauNum00b","32",&status);
  vvd(0.00095435,0.9999999991671806,1e-12,"iauNum00b","33",&status);
  iauNum06a(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999999999536228,1e-12,"iauNum06a","11",&status);
  vvd((double)idmsf._8_8_,8.836241998111535e-06,1e-12,"iauNum06a","12",&status);
  vvd(-0.216735543,3.8308346084152875e-06,1e-12,"iauNum06a","13",&status);
  vvd(-5.60956681,-8.83608633487074e-06,1e-12,"iauNum06a","21",&status);
  vvd(-1.98079819,0.9999999991354658,1e-12,"iauNum06a","22",&status);
  vvd(0.0030723249,-4.063240188248455e-05,1e-12,"iauNum06a","23",&status);
  vvd(-0.00406995477,-3.831193642839398e-06,1e-12,"iauNum06a","31",&status);
  vvd(-0.00181335842,4.0632368031014796e-05,1e-12,"iauNum06a","32",&status);
  vvd(0.00095435,0.9999999991671663,1e-12,"iauNum06a","33",&status);
  iauNumat(0.409078976335651,-9.630909107115582e-06,4.063239174001679e-05,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999999999536228,1e-12,"iauNumat","11",&status);
  vvd((double)idmsf._8_8_,8.83623932023625e-06,1e-12,"iauNumat","12",&status);
  vvd(-0.216735543,3.830833447458252e-06,1e-12,"iauNumat","13",&status);
  vvd(-5.60956681,-8.83608365701669e-06,1e-12,"iauNumat","21",&status);
  vvd(-1.98079819,0.9999999991354654,1e-12,"iauNumat","22",&status);
  vvd(0.0030723249,-4.0632408653618574e-05,1e-12,"iauNumat","23",&status);
  vvd(-0.00406995477,-3.8311924818333855e-06,1e-12,"iauNumat","31",&status);
  vvd(-0.00181335842,4.063237480216934e-05,1e-12,"iauNumat","32",&status);
  vvd(0.00095435,0.9999999991671661,1e-12,"iauNumat","33",&status);
  iauNut00a(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-9.630909107115518e-06,1e-13,"iauNut00a","dpsi",&status);
  vvd(eo,4.063239174001679e-05,1e-13,"iauNut00a","deps",&status);
  iauNut00b(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-9.632552291148363e-06,1e-13,"iauNut00b","dpsi",&status);
  vvd(eo,4.063197106621159e-05,1e-13,"iauNut00b","deps",&status);
  iauNut06a(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-9.63091202582031e-06,1e-13,"iauNut06a","dpsi",&status);
  vvd(eo,4.06323849688725e-05,1e-13,"iauNut06a","deps",&status);
  iauNut80(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-9.643658353226563e-06,1e-13,"iauNut80","dpsi",&status);
  vvd(eo,4.060051006879713e-05,1e-13,"iauNut80","deps",&status);
  iauNutm80(2400000.5,53736.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999999999535,1e-12,"iauNutm80","11",&status);
  vvd((double)idmsf._8_8_,8.847935789636432e-06,1e-12,"iauNutm80","12",&status);
  vvd(-0.216735543,3.8359065021640195e-06,1e-12,"iauNutm80","13",&status);
  vvd(-5.60956681,-8.847780042583437e-06,1e-12,"iauNutm80","21",&status);
  vvd(-1.98079819,0.999999999136657,1e-12,"iauNutm80","22",&status);
  vvd(0.0030723249,-4.060052702727131e-05,1e-12,"iauNutm80","23",&status);
  vvd(-0.00406995477,-3.836265729708479e-06,1e-12,"iauNutm80","31",&status);
  vvd(-0.00181335842,4.0600493086126384e-05,1e-12,"iauNutm80","32",&status);
  vvd(0.00095435,0.9999999991684415,1e-12,"iauNutm80","33",&status);
  dVar1 = iauObl06(2400000.5,54388.0);
  vvd(dVar1,0.4090749229387258,1e-14,"iauObl06","",&status);
  dVar1 = iauObl80(2400000.5,54388.0);
  vvd(dVar1,0.4090751347643816,1e-14,"iauObl80","",&status);
  iauP06e(2400000.5,52541.0,(double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1,&bpia,&epsa,&chia,&za,&zetaa,
          &thetaa,&pa,&gam,&phi_1,&local_88);
  vvd((double)idmsf._0_8_,0.4090926006005829,1e-14,"iauP06e","eps0",&status);
  vvd(eo,0.0006664369630191613,1e-14,"iauP06e","psia",&status);
  vvd(ppr[0],0.4090925973783256,1e-14,"iauP06e","oma",&status);
  vvd(da_1,5.561149371265209e-07,1e-14,"iauP06e","bpa",&status);
  vvd(di_2,-6.191517193290621e-06,1e-14,"iauP06e","bqa",&status);
  vvd(rob_1,6.216441751884383e-06,1e-14,"iauP06e","pia",&status);
  vvd(bpia,3.0520141800237797,1e-14,"iauP06e","bpia",&status);
  vvd(epsa,0.4090864054922432,1e-14,"iauP06e","epsa",&status);
  vvd(chia,1.3877033795309153e-06,1e-14,"iauP06e","chia",&status);
  vvd(za,0.00029217898466517907,1e-14,"iauP06e","za",&status);
  vvd(zetaa,0.0003178773290332009,1e-14,"iauP06e","zetaa",&status);
  vvd(thetaa,0.00026509327016574973,1e-14,"iauP06e","thetaa",&status);
  vvd(pa,0.0006651637681381016,1e-14,"iauP06e","pa",&status);
  vvd(gam,1.398077115963755e-06,1e-14,"iauP06e","gam",&status);
  vvd(phi_1,0.40908640908374627,1e-14,"iauP06e","phi",&status);
  vvd(local_88,0.0006664464807480921,1e-14,"iauP06e","psi",&status);
  eo = 0.25;
  dStack_1f0 = 1.2;
  local_1e8 = 3.0;
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauP2pv(&eo,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.25,0.0,"iauP2pv","p1",&status);
  vvd((double)idmsf._8_8_,1.2,0.0,"iauP2pv","p2",&status);
  vvd(-2.5,3.0,0.0,"iauP2pv","p3",&status);
  vvd(-0.5,0.0,0.0,"iauP2pv","v1",&status);
  vvd(3.1,0.0,0.0,"iauP2pv","v2",&status);
  vvd(0.9,0.0,0.0,"iauP2pv","v3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40590000;
  idmsf[2] = 0;
  idmsf[3] = -0x3fb70000;
  iauP2s((double *)idmsf,&eo,ppr,&da_1);
  vvd(eo,-0.4636476090008061,1e-12,"iauP2s","theta",&status);
  vvd(ppr[0],0.21998797739545944,1e-12,"iauP2s","phi",&status);
  vvd(da_1,114.564392373896,1e-09,"iauP2s","r",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x3ff00000;
  idmsf[2] = -0x66666666;
  idmsf[3] = 0x3fb99999;
  eo = -3.0;
  dStack_1f0 = 0.001;
  local_1e8 = 0.2;
  dVar1 = iauPap((double *)idmsf,&eo);
  vvd(dVar1,0.3671514267841114,1e-12,"iauPap","",&status);
  dVar1 = iauPas(1.0,0.1,0.2,-1.0);
  vvd(dVar1,-2.7245449229322705,1e-12,"iauPas","",&status);
  iauPb06(2400000.5,50123.9999,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,-0.0005092634016326479,1e-12,"iauPb06","bzeta",&status);
  vvd(eo,-0.00036027720605660444,1e-12,"iauPb06","bz",&status);
  vvd(ppr[0],-0.0003779735537167811,1e-12,"iauPb06","btheta",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  dVar1 = iauPdp((double *)idmsf,&eo);
  vvd(dVar1,20.0,1e-12,"iauPdp","",&status);
  iauPfw06(2400000.5,50123.9999,(double *)idmsf,&eo,ppr,&da_1);
  vvd((double)idmsf._0_8_,-2.2433876709979958e-06,1e-16,"iauPfw06","gamb",&status);
  vvd(eo,0.4091014602391313,1e-12,"iauPfw06","phib",&status);
  vvd(ppr[0],-0.0009501954178013031,1e-14,"iauPfw06","psib",&status);
  vvd(da_1,0.40910143165873675,1e-12,"iauPfw06","epsa",&status);
  iVar2 = iauPlan94(2400000.5,1000000.0,0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.0,0.0,"iauPlan94","x 1",&status);
  vvd((double)idmsf._8_8_,0.0,0.0,"iauPlan94","y 1",&status);
  vvd(3.0,0.0,0.0,"iauPlan94","z 1",&status);
  vvd(-0.5,0.0,0.0,"iauPlan94","xd 1",&status);
  vvd(3.1,0.0,0.0,"iauPlan94","yd 1",&status);
  vvd(0.9,0.0,0.0,"iauPlan94","zd 1",&status);
  viv(iVar2,-1,"iauPlan94","j 1",&status);
  iVar2 = iauPlan94(2400000.5,1000000.0,10,(double (*) [3])idmsf);
  viv(iVar2,-1,"iauPlan94","j 2",&status);
  iVar2 = iauPlan94(2400000.5,-320000.0,3,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9308038666832976,1e-11,"iauPlan94","x 3",&status);
  vvd((double)idmsf._8_8_,0.3258319040261346,1e-11,"iauPlan94","y 3",&status);
  vvd(3.0,0.14227945444811405,1e-11,"iauPlan94","z 3",&status);
  vvd(-0.5,-0.00642945895825517,1e-11,"iauPlan94","xd 3",&status);
  vvd(3.1,0.014685706577042377,1e-11,"iauPlan94","yd 3",&status);
  vvd(0.9,0.006406996426270981,1e-11,"iauPlan94","zd 3",&status);
  viv(iVar2,1,"iauPlan94","j 3",&status);
  iVar2 = iauPlan94(2400000.5,43999.9,1,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.29452939592574306,1e-11,"iauPlan94","x 4",&status);
  vvd((double)idmsf._8_8_,-0.24522041766010497,1e-11,"iauPlan94","y 4",&status);
  vvd(3.0,-0.1615427700571978,1e-11,"iauPlan94","z 4",&status);
  vvd(-0.5,0.014138678714046145,1e-11,"iauPlan94","xd 4",&status);
  vvd(3.1,0.019465483011047065,1e-11,"iauPlan94","yd 4",&status);
  vvd(0.9,0.008929809783898904,1e-11,"iauPlan94","zd 4",&status);
  viv(iVar2,0,"iauPlan94","j 4",&status);
  iauPmat00(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995505175088,1e-12,"iauPmat00","11",&status);
  vvd((double)idmsf._8_8_,0.0008695405883617885,1e-14,"iauPmat00","12",&status);
  vvd(3.0,0.0003779734722239007,1e-14,"iauPmat00","13",&status);
  vvd(-0.5,-0.0008695405990410864,1e-14,"iauPmat00","21",&status);
  vvd(3.1,0.9999996219494925,1e-12,"iauPmat00","22",&status);
  vvd(0.9,-1.360775820404982e-07,1e-14,"iauPmat00","23",&status);
  vvd(-0.00406995477,-0.0003779734476558185,1e-14,"iauPmat00","31",&status);
  vvd(-0.00181335842,-1.925857585832024e-07,1e-14,"iauPmat00","32",&status);
  vvd(0.00095435,0.9999999285680153,1e-12,"iauPmat00","33",&status);
  iauPmat06(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995505176007,1e-12,"iauPmat06","11",&status);
  vvd((double)idmsf._8_8_,0.0008695404617348209,1e-14,"iauPmat06","12",&status);
  vvd(3.0,0.0003779735201865589,1e-14,"iauPmat06","13",&status);
  vvd(-0.5,-0.0008695404723772031,1e-14,"iauPmat06","21",&status);
  vvd(3.1,0.9999996219496027,1e-12,"iauPmat06","22",&status);
  vvd(0.9,-1.3617524970802702e-07,1e-14,"iauPmat06","23",&status);
  vvd(-0.00406995477,-0.00037797349570340897,1e-14,"iauPmat06","31",&status);
  vvd(-0.00181335842,-1.924880847894457e-07,1e-14,"iauPmat06","32",&status);
  vvd(0.00095435,0.9999999285679972,1e-12,"iauPmat06","33",&status);
  iauPmat76(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995504328351,1e-12,"iauPmat76","11",&status);
  vvd((double)idmsf._8_8_,0.0008696632209480961,1e-14,"iauPmat76","12",&status);
  vvd(3.0,0.00037791534749598884,1e-14,"iauPmat76","13",&status);
  vvd(-0.5,-0.0008696632209485112,1e-14,"iauPmat76","21",&status);
  vvd(3.1,0.9999996218428561,1e-12,"iauPmat76","22",&status);
  vvd(0.9,-1.6432847761118864e-07,1e-14,"iauPmat76","23",&status);
  vvd(-0.00406995477,-0.0003779153474950335,1e-14,"iauPmat76","31",&status);
  vvd(-0.00181335842,-1.643306746147367e-07,1e-14,"iauPmat76","32",&status);
  vvd(0.00095435,0.999999928589979,1e-12,"iauPmat76","33",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  dVar1 = iauPm((double *)idmsf);
  vvd(dVar1,2.7892651361962706,1e-12,"iauPm","",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  iauPmp((double *)idmsf,&eo,ppr);
  vvd(ppr[0],1.0,1e-12,"iauPmp","0",&status);
  vvd(ppr[1],-1.0,1e-12,"iauPmp","1",&status);
  vvd(ppr[2],-1.0,1e-12,"iauPmp","2",&status);
  idmsf[0] = -0x33333333;
  idmsf[1] = 0x3feccccc;
  idmsf[2] = -0x66666666;
  idmsf[3] = 0x3fd99999;
  iauPmpx(1.234,0.789,1e-05,-2e-05,0.01,10.0,8.75,(double *)idmsf,&eo);
  vvd(eo,0.23281376239603085,1e-12,"iauPmpx","1",&status);
  vvd(dStack_1f0,0.6651097085397856,1e-12,"iauPmpx","2",&status);
  vvd(local_1e8,0.709525776589636,1e-12,"iauPmpx","3",&status);
  iVar2 = iauPmsafe(1.234,0.789,1e-05,-2e-05,0.01,10.0,2400000.5,48348.5625,2400000.5,51544.5,
                    (double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,1.234087484501017,1e-12,"iauPmsafe","ra2",&status);
  vvd(eo,0.7888249982450468,1e-12,"iauPmsafe","dec2",&status);
  vvd(ppr[0],9.996457663586074e-06,1e-12,"iauPmsafe","pmr2",&status);
  vvd(da_1,-2.0000400851067547e-05,1e-16,"iauPmsafe","pmd2",&status);
  vvd(di_2,0.009999997295356831,1e-12,"iauPmsafe","px2",&status);
  vvd(rob_1,10.3846838029392,1e-10,"iauPmsafe","rv2",&status);
  viv(iVar2,0,"iauPmsafe","j",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauPn((double *)idmsf,ppr,&eo);
  vvd(ppr[0],2.7892651361962706,1e-12,"iauPn","r",&status);
  vvd(eo,0.10755521090731121,1e-12,"iauPn","u1",&status);
  vvd(dStack_1f0,0.43022084362924484,1e-12,"iauPn","u2",&status);
  vvd(local_1e8,-0.8962934242275934,1e-12,"iauPn","u3",&status);
  iauPn00(2400000.5,53736.0,-9.632552291149336e-06,4.0631971066211414e-05,&rob_1,
          (double (*) [3])idmsf,(double (*) [3])&eo,&ppr,(double (*) [3])&da_1,(double (*) [3])&di_2
         );
  vvd(rob_1,0.409079178940423,1e-12,"iauPn00","epsa",&status);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauPn00","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078279744199197e-08,1e-18,"iauPn00","rb12",&status);
  vvd(-2.5,8.056217146976134e-08,1e-18,"iauPn00","rb13",&status);
  vvd(-0.5,7.078279477857338e-08,1e-18,"iauPn00","rb21",&status);
  vvd(3.1,0.999999999999997,1e-12,"iauPn00","rb22",&status);
  vvd(0.9,3.3060414542221364e-08,1e-18,"iauPn00","rb23",&status);
  vvd(-0.00406995477,-8.056217380986972e-08,1e-18,"iauPn00","rb31",&status);
  vvd(-0.00181335842,-3.3060408839805523e-08,1e-18,"iauPn00","rb32",&status);
  vvd(0.00095435,0.9999999999999962,1e-12,"iauPn00","rb33",&status);
  vvd(eo,0.9999989300532289,1e-12,"iauPn00","rp11",&status);
  vvd(dStack_1f0,-0.0013416472267918243,1e-14,"iauPn00","rp12",&status);
  vvd(local_1e8,-0.0005829880927190296,1e-14,"iauPn00","rp13",&status);
  vvd(dStack_1e0,0.001341647231069759,1e-14,"iauPn00","rp21",&status);
  vvd(local_1d8,0.999999099990875,1e-12,"iauPn00","rp22",&status);
  vvd(dStack_1d0,-3.8374444415837154e-07,1e-14,"iauPn00","rp23",&status);
  vvd(local_1c8,0.0005829880828740958,1e-14,"iauPn00","rp31",&status);
  vvd(dStack_1c0,-3.984203267708835e-07,1e-14,"iauPn00","rp32",&status);
  vvd(local_1b8,0.9999998300623538,1e-12,"iauPn00","rp33",&status);
  vvd(ppr[0],0.9999989300052244,1e-12,"iauPn00","rbp11",&status);
  vvd(ppr[1],-0.0013417179902397037,1e-14,"iauPn00","rbp12",&status);
  vvd(ppr[2],-0.0005829075749891684,1e-14,"iauPn00","rbp13",&status);
  vvd(0.00364365824,0.00134171801383174,1e-14,"iauPn00","rbp21",&status);
  vvd(-0.0154287319,0.9999990998959192,1e-12,"iauPn00","rbp22",&status);
  vvd(-0.00668922024,-3.505759733565421e-07,1e-14,"iauPn00","rbp23",&status);
  vvd(local_318,0.0005829075206857718,1e-14,"iauPn00","rbp31",&status);
  vvd(local_310,-4.315219955198609e-07,1e-14,"iauPn00","rbp32",&status);
  vvd(local_308,0.9999998301093036,1e-12,"iauPn00","rbp33",&status);
  vvd(da_1,0.999999999953607,1e-12,"iauPn00","rn11",&status);
  vvd(dStack_120,8.83774614487214e-06,1e-16,"iauPn00","rn12",&status);
  vvd(local_118,3.83148883825259e-06,1e-16,"iauPn00","rn13",&status);
  vvd(local_110,-8.837590456633198e-06,1e-16,"iauPn00","rn21",&status);
  vvd(local_108,0.9999999991354692,1e-12,"iauPn00","rn22",&status);
  vvd(local_100,-4.063198798559574e-05,1e-16,"iauPn00","rn23",&status);
  vvd(local_f8,-3.831847930135328e-06,1e-16,"iauPn00","rn31",&status);
  vvd(local_f0,4.0631954122581504e-05,1e-16,"iauPn00","rn32",&status);
  vvd(local_e8,0.9999999991671806,1e-12,"iauPn00","rn33",&status);
  vvd(di_2,0.9999989440499982,1e-12,"iauPn00","rbpn11",&status);
  vvd(local_d0,-0.0013328802536408484,1e-14,"iauPn00","rbpn12",&status);
  vvd(local_c8,-0.0005790760898731087,1e-14,"iauPn00","rbpn13",&status);
  vvd(local_c0,0.0013328567469799487,1e-14,"iauPn00","rbpn21",&status);
  vvd(local_b8,0.9999991109064769,1e-12,"iauPn00","rbpn22",&status);
  vvd(local_b0,-4.097740555723064e-05,1e-14,"iauPn00","rbpn23",&status);
  vvd(local_a8,0.0005791301929950205,1e-14,"iauPn00","rbpn31",&status);
  vvd(local_a0,4.020553681373703e-05,1e-14,"iauPn00","rbpn32",&status);
  vvd(local_98,0.999999831495853,1e-12,"iauPn00","rbpn33",&status);
  iauPn00a(2400000.5,53736.0,&rob_1,&bpia,&epsa,(double (*) [3])idmsf,(double (*) [3])&eo,&ppr,
           (double (*) [3])&da_1,(double (*) [3])&di_2);
  vvd(rob_1,-9.630909107115518e-06,1e-12,"iauPn00a","dpsi",&status);
  vvd(bpia,4.063239174001679e-05,1e-12,"iauPn00a","deps",&status);
  vvd(epsa,0.409079178940423,1e-12,"iauPn00a","epsa",&status);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauPn00a","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078279744199197e-08,1e-16,"iauPn00a","rb12",&status);
  vvd(-2.5,8.056217146976134e-08,1e-16,"iauPn00a","rb13",&status);
  vvd(-0.5,7.078279477857338e-08,1e-16,"iauPn00a","rb21",&status);
  vvd(3.1,0.999999999999997,1e-12,"iauPn00a","rb22",&status);
  vvd(0.9,3.3060414542221364e-08,1e-16,"iauPn00a","rb23",&status);
  vvd(-0.00406995477,-8.056217380986972e-08,1e-16,"iauPn00a","rb31",&status);
  vvd(-0.00181335842,-3.3060408839805523e-08,1e-16,"iauPn00a","rb32",&status);
  vvd(0.00095435,0.9999999999999962,1e-12,"iauPn00a","rb33",&status);
  vvd(eo,0.9999989300532289,1e-12,"iauPn00a","rp11",&status);
  vvd(dStack_1f0,-0.0013416472267918243,1e-14,"iauPn00a","rp12",&status);
  vvd(local_1e8,-0.0005829880927190296,1e-14,"iauPn00a","rp13",&status);
  vvd(dStack_1e0,0.001341647231069759,1e-14,"iauPn00a","rp21",&status);
  vvd(local_1d8,0.999999099990875,1e-12,"iauPn00a","rp22",&status);
  vvd(dStack_1d0,-3.8374444415837154e-07,1e-14,"iauPn00a","rp23",&status);
  vvd(local_1c8,0.0005829880828740958,1e-14,"iauPn00a","rp31",&status);
  vvd(dStack_1c0,-3.984203267708835e-07,1e-14,"iauPn00a","rp32",&status);
  vvd(local_1b8,0.9999998300623538,1e-12,"iauPn00a","rp33",&status);
  vvd(ppr[0],0.9999989300052244,1e-12,"iauPn00a","rbp11",&status);
  vvd(ppr[1],-0.0013417179902397037,1e-14,"iauPn00a","rbp12",&status);
  vvd(ppr[2],-0.0005829075749891684,1e-14,"iauPn00a","rbp13",&status);
  vvd(0.00364365824,0.00134171801383174,1e-14,"iauPn00a","rbp21",&status);
  vvd(-0.0154287319,0.9999990998959192,1e-12,"iauPn00a","rbp22",&status);
  vvd(-0.00668922024,-3.505759733565421e-07,1e-14,"iauPn00a","rbp23",&status);
  vvd(local_318,0.0005829075206857718,1e-14,"iauPn00a","rbp31",&status);
  vvd(local_310,-4.315219955198609e-07,1e-14,"iauPn00a","rbp32",&status);
  vvd(local_308,0.9999998301093036,1e-12,"iauPn00a","rbp33",&status);
  vvd(da_1,0.9999999999536228,1e-12,"iauPn00a","rn11",&status);
  vvd(dStack_120,8.836238544090872e-06,1e-14,"iauPn00a","rn12",&status);
  vvd(local_118,3.830835237722401e-06,1e-14,"iauPn00a","rn13",&status);
  vvd(local_110,-8.83608288079857e-06,1e-14,"iauPn00a","rn21",&status);
  vvd(local_108,0.9999999991354656,1e-12,"iauPn00a","rn22",&status);
  vvd(local_100,-4.0632408653625e-05,1e-14,"iauPn00a","rn23",&status);
  vvd(local_f8,-3.831194272065996e-06,1e-14,"iauPn00a","rn31",&status);
  vvd(local_f0,4.063237480216292e-05,1e-14,"iauPn00a","rn32",&status);
  vvd(local_e8,0.9999999991671661,1e-12,"iauPn00a","rn33",&status);
  vvd(di_2,0.9999989440476104,1e-12,"iauPn00a","rbpn11",&status);
  vvd(local_d0,-0.0013328817612400117,1e-14,"iauPn00a","rbpn12",&status);
  vvd(local_c8,-0.0005790767434730086,1e-14,"iauPn00a","rbpn13",&status);
  vvd(local_c0,0.0013328582543089547,1e-14,"iauPn00a","rbpn21",&status);
  vvd(local_b8,0.9999991109044506,1e-12,"iauPn00a","rbpn22",&status);
  vvd(local_b0,-4.0977827103965806e-05,1e-14,"iauPn00a","rbpn23",&status);
  vvd(local_a8,0.0005791308472168153,1e-14,"iauPn00a","rbpn31",&status);
  vvd(local_a0,4.0205956615915e-05,1e-14,"iauPn00a","rbpn32",&status);
  vvd(local_98,0.9999998314954572,1e-12,"iauPn00a","rbpn33",&status);
  iauPn00b(2400000.5,53736.0,&rob_1,&bpia,&epsa,(double (*) [3])idmsf,(double (*) [3])&eo,&ppr,
           (double (*) [3])&da_1,(double (*) [3])&di_2);
  vvd(rob_1,-9.632552291148363e-06,1e-12,"iauPn00b","dpsi",&status);
  vvd(bpia,4.063197106621159e-05,1e-12,"iauPn00b","deps",&status);
  vvd(epsa,0.409079178940423,1e-12,"iauPn00b","epsa",&status);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauPn00b","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078279744199197e-08,1e-16,"iauPn00b","rb12",&status);
  vvd(-2.5,8.056217146976134e-08,1e-16,"iauPn00b","rb13",&status);
  vvd(-0.5,7.078279477857338e-08,1e-16,"iauPn00b","rb21",&status);
  vvd(3.1,0.999999999999997,1e-12,"iauPn00b","rb22",&status);
  vvd(0.9,3.3060414542221364e-08,1e-16,"iauPn00b","rb23",&status);
  vvd(-0.00406995477,-8.056217380986972e-08,1e-16,"iauPn00b","rb31",&status);
  vvd(-0.00181335842,-3.3060408839805523e-08,1e-16,"iauPn00b","rb32",&status);
  vvd(0.00095435,0.9999999999999962,1e-12,"iauPn00b","rb33",&status);
  vvd(eo,0.9999989300532289,1e-12,"iauPn00b","rp11",&status);
  vvd(dStack_1f0,-0.0013416472267918243,1e-14,"iauPn00b","rp12",&status);
  vvd(local_1e8,-0.0005829880927190296,1e-14,"iauPn00b","rp13",&status);
  vvd(dStack_1e0,0.001341647231069759,1e-14,"iauPn00b","rp21",&status);
  vvd(local_1d8,0.999999099990875,1e-12,"iauPn00b","rp22",&status);
  vvd(dStack_1d0,-3.8374444415837154e-07,1e-14,"iauPn00b","rp23",&status);
  vvd(local_1c8,0.0005829880828740958,1e-14,"iauPn00b","rp31",&status);
  vvd(dStack_1c0,-3.984203267708835e-07,1e-14,"iauPn00b","rp32",&status);
  vvd(local_1b8,0.9999998300623538,1e-12,"iauPn00b","rp33",&status);
  vvd(ppr[0],0.9999989300052244,1e-12,"iauPn00b","rbp11",&status);
  vvd(ppr[1],-0.0013417179902397037,1e-14,"iauPn00b","rbp12",&status);
  vvd(ppr[2],-0.0005829075749891684,1e-14,"iauPn00b","rbp13",&status);
  vvd(0.00364365824,0.00134171801383174,1e-14,"iauPn00b","rbp21",&status);
  vvd(-0.0154287319,0.9999990998959192,1e-12,"iauPn00b","rbp22",&status);
  vvd(-0.00668922024,-3.505759733565421e-07,1e-14,"iauPn00b","rbp23",&status);
  vvd(local_318,0.0005829075206857718,1e-14,"iauPn00b","rbp31",&status);
  vvd(local_310,-4.315219955198609e-07,1e-14,"iauPn00b","rbp32",&status);
  vvd(local_308,0.9999998301093036,1e-12,"iauPn00b","rbp33",&status);
  vvd(da_1,0.999999999953607,1e-12,"iauPn00b","rn11",&status);
  vvd(dStack_120,8.837746144871248e-06,1e-14,"iauPn00b","rn12",&status);
  vvd(local_118,3.831488838252203e-06,1e-14,"iauPn00b","rn13",&status);
  vvd(local_110,-8.837590456632305e-06,1e-14,"iauPn00b","rn21",&status);
  vvd(local_108,0.9999999991354692,1e-12,"iauPn00b","rn22",&status);
  vvd(local_100,-4.0631987985595914e-05,1e-14,"iauPn00b","rn23",&status);
  vvd(local_f8,-3.831847930134941e-06,1e-14,"iauPn00b","rn31",&status);
  vvd(local_f0,4.063195412258168e-05,1e-14,"iauPn00b","rn32",&status);
  vvd(local_e8,0.9999999991671806,1e-12,"iauPn00b","rn33",&status);
  vvd(di_2,0.9999989440499982,1e-12,"iauPn00b","rbpn11",&status);
  vvd(local_d0,-0.0013328802536408493,1e-14,"iauPn00b","rbpn12",&status);
  vvd(local_c8,-0.0005790760898731092,1e-14,"iauPn00b","rbpn13",&status);
  vvd(local_c0,0.0013328567469799496,1e-14,"iauPn00b","rbpn21",&status);
  vvd(local_b8,0.9999991109064769,1e-12,"iauPn00b","rbpn22",&status);
  vvd(local_b0,-4.097740555723082e-05,1e-14,"iauPn00b","rbpn23",&status);
  vvd(local_a8,0.0005791301929950209,1e-14,"iauPn00b","rbpn31",&status);
  vvd(local_a0,4.0205536813737205e-05,1e-14,"iauPn00b","rbpn32",&status);
  vvd(local_98,0.999999831495853,1e-12,"iauPn00b","rbpn33",&status);
  iauPn06a(2400000.5,53736.0,&rob_1,&bpia,&epsa,(double (*) [3])idmsf,(double (*) [3])&eo,&ppr,
           (double (*) [3])&da_1,(double (*) [3])&di_2);
  vvd(rob_1,-9.63091202582031e-06,1e-12,"iauPn06a","dpsi",&status);
  vvd(bpia,4.06323849688725e-05,1e-12,"iauPn06a","deps",&status);
  vvd(epsa,0.409078976335651,1e-12,"iauPn06a","epsa",&status);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauPn06a","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078368960971557e-08,1e-14,"iauPn06a","rb12",&status);
  vvd(-2.5,8.056213977613186e-08,1e-14,"iauPn06a","rb13",&status);
  vvd(-0.5,7.078368694637675e-08,1e-14,"iauPn06a","rb21",&status);
  vvd(3.1,0.999999999999997,1e-12,"iauPn06a","rb22",&status);
  vvd(0.9,3.305943742989134e-08,1e-14,"iauPn06a","rb23",&status);
  vvd(-0.00406995477,-8.056214211620056e-08,1e-14,"iauPn06a","rb31",&status);
  vvd(-0.00181335842,-3.305943172740587e-08,1e-14,"iauPn06a","rb32",&status);
  vvd(0.00095435,0.9999999999999962,1e-12,"iauPn06a","rb33",&status);
  vvd(eo,0.9999989300536855,1e-12,"iauPn06a","rp11",&status);
  vvd(dStack_1f0,-0.0013416468862044438,1e-14,"iauPn06a","rp12",&status);
  vvd(local_1e8,-0.0005829880933488628,1e-14,"iauPn06a","rp13",&status);
  vvd(dStack_1e0,0.0013416468905697821,1e-14,"iauPn06a","rp21",&status);
  vvd(local_1d8,0.999999099991332,1e-12,"iauPn06a","rp22",&status);
  vvd(dStack_1d0,-3.835944216374477e-07,1e-14,"iauPn06a","rp23",&status);
  vvd(local_1c8,0.0005829880833027868,1e-14,"iauPn06a","rp31",&status);
  vvd(dStack_1c0,-3.985701514686976e-07,1e-14,"iauPn06a","rp32",&status);
  vvd(local_1b8,0.9999998300623535,1e-12,"iauPn06a","rp33",&status);
  vvd(ppr[0],0.9999989300056797,1e-12,"iauPn06a","rbp11",&status);
  vvd(ppr[1],-0.0013417176505450595,1e-14,"iauPn06a","rbp12",&status);
  vvd(ppr[2],-0.0005829075756493729,1e-14,"iauPn06a","rbp13",&status);
  vvd(0.00364365824,0.001341717674223918,1e-14,"iauPn06a","rbp21",&status);
  vvd(-0.0154287319,0.9999990998963748,1e-12,"iauPn06a","rbp22",&status);
  vvd(-0.00668922024,-3.504269280170069e-07,1e-14,"iauPn06a","rbp23",&status);
  vvd(local_318,0.0005829075211461455,1e-14,"iauPn06a","rbp31",&status);
  vvd(local_310,-4.316708436255949e-07,1e-14,"iauPn06a","rbp32",&status);
  vvd(local_308,0.9999998301093033,1e-12,"iauPn06a","rbp33",&status);
  vvd(da_1,0.9999999999536228,1e-12,"iauPn06a","rn11",&status);
  vvd(dStack_120,8.836241998111535e-06,1e-14,"iauPn06a","rn12",&status);
  vvd(local_118,3.8308346084152875e-06,1e-14,"iauPn06a","rn13",&status);
  vvd(local_110,-8.83608633487074e-06,1e-14,"iauPn06a","rn21",&status);
  vvd(local_108,0.9999999991354658,1e-12,"iauPn06a","rn22",&status);
  vvd(local_100,-4.063240188248455e-05,1e-14,"iauPn06a","rn23",&status);
  vvd(local_f8,-3.831193642839398e-06,1e-14,"iauPn06a","rn31",&status);
  vvd(local_f0,4.0632368031014796e-05,1e-14,"iauPn06a","rn32",&status);
  vvd(local_e8,0.9999999991671663,1e-12,"iauPn06a","rn33",&status);
  vvd(di_2,0.999998944048067,1e-12,"iauPn06a","rbpn11",&status);
  vvd(local_d0,-0.001332881418091916,1e-14,"iauPn06a","rbpn12",&status);
  vvd(local_c8,-0.0005790767447612043,1e-14,"iauPn06a","rbpn13",&status);
  vvd(local_c0,0.0013328579112509892,1e-14,"iauPn06a","rbpn21",&status);
  vvd(local_b8,0.9999991109049142,1e-12,"iauPn06a","rbpn22",&status);
  vvd(local_b0,-4.097767128546785e-05,1e-14,"iauPn06a","rbpn23",&status);
  vvd(local_a8,0.0005791308482835292,1e-14,"iauPn06a","rbpn31",&status);
  vvd(local_a0,4.0205800994540205e-05,1e-14,"iauPn06a","rbpn32",&status);
  vvd(local_98,0.9999998314954629,1e-12,"iauPn06a","rbpn33",&status);
  iauPn06(2400000.5,53736.0,-9.632552291149336e-06,4.0631971066211414e-05,&rob_1,
          (double (*) [3])idmsf,(double (*) [3])&eo,&ppr,(double (*) [3])&da_1,(double (*) [3])&di_2
         );
  vvd(rob_1,0.409078976335651,1e-12,"iauPn06","epsa",&status);
  vvd((double)idmsf._0_8_,0.9999999999999942,1e-12,"iauPn06","rb11",&status);
  vvd((double)idmsf._8_8_,-7.078368960971557e-08,1e-14,"iauPn06","rb12",&status);
  vvd(-2.5,8.056213977613186e-08,1e-14,"iauPn06","rb13",&status);
  vvd(-0.5,7.078368694637675e-08,1e-14,"iauPn06","rb21",&status);
  vvd(3.1,0.999999999999997,1e-12,"iauPn06","rb22",&status);
  vvd(0.9,3.305943742989134e-08,1e-14,"iauPn06","rb23",&status);
  vvd(-0.00406995477,-8.056214211620056e-08,1e-14,"iauPn06","rb31",&status);
  vvd(-0.00181335842,-3.305943172740587e-08,1e-14,"iauPn06","rb32",&status);
  vvd(0.00095435,0.9999999999999962,1e-12,"iauPn06","rb33",&status);
  vvd(eo,0.9999989300536855,1e-12,"iauPn06","rp11",&status);
  vvd(dStack_1f0,-0.0013416468862044438,1e-14,"iauPn06","rp12",&status);
  vvd(local_1e8,-0.0005829880933488628,1e-14,"iauPn06","rp13",&status);
  vvd(dStack_1e0,0.0013416468905697821,1e-14,"iauPn06","rp21",&status);
  vvd(local_1d8,0.999999099991332,1e-12,"iauPn06","rp22",&status);
  vvd(dStack_1d0,-3.835944216374477e-07,1e-14,"iauPn06","rp23",&status);
  vvd(local_1c8,0.0005829880833027868,1e-14,"iauPn06","rp31",&status);
  vvd(dStack_1c0,-3.985701514686976e-07,1e-14,"iauPn06","rp32",&status);
  vvd(local_1b8,0.9999998300623535,1e-12,"iauPn06","rp33",&status);
  vvd(ppr[0],0.9999989300056797,1e-12,"iauPn06","rbp11",&status);
  vvd(ppr[1],-0.0013417176505450595,1e-14,"iauPn06","rbp12",&status);
  vvd(ppr[2],-0.0005829075756493729,1e-14,"iauPn06","rbp13",&status);
  vvd(0.00364365824,0.001341717674223918,1e-14,"iauPn06","rbp21",&status);
  vvd(-0.0154287319,0.9999990998963748,1e-12,"iauPn06","rbp22",&status);
  vvd(-0.00668922024,-3.504269280170069e-07,1e-14,"iauPn06","rbp23",&status);
  vvd(local_318,0.0005829075211461455,1e-14,"iauPn06","rbp31",&status);
  vvd(local_310,-4.316708436255949e-07,1e-14,"iauPn06","rbp32",&status);
  vvd(local_308,0.9999998301093033,1e-12,"iauPn06","rbp33",&status);
  vvd(da_1,0.999999999953607,1e-12,"iauPn06","rn11",&status);
  vvd(dStack_120,8.837746921149881e-06,1e-14,"iauPn06","rn12",&status);
  vvd(local_118,3.831487047682968e-06,1e-14,"iauPn06","rn13",&status);
  vvd(local_110,-8.837591232983692e-06,1e-14,"iauPn06","rn21",&status);
  vvd(local_108,0.9999999991354692,1e-12,"iauPn06","rn22",&status);
  vvd(local_100,-4.0631987985589314e-05,1e-14,"iauPn06","rn23",&status);
  vvd(local_f8,-3.831846139597251e-06,1e-14,"iauPn06","rn31",&status);
  vvd(local_f0,4.063195412258793e-05,1e-14,"iauPn06","rn32",&status);
  vvd(local_e8,0.9999999991671806,1e-12,"iauPn06","rn33",&status);
  vvd(di_2,0.9999989440504506,1e-12,"iauPn06","rbpn11",&status);
  vvd(local_d0,-0.0013328799131704927,1e-14,"iauPn06","rbpn12",&status);
  vvd(local_c8,-0.0005790760923225656,1e-14,"iauPn06","rbpn13",&status);
  vvd(local_c0,0.0013328564065957548,1e-14,"iauPn06","rbpn21",&status);
  vvd(local_b8,0.9999991109069367,1e-12,"iauPn06","rbpn22",&status);
  vvd(local_b0,-4.0977256511426416e-05,1e-14,"iauPn06","rbpn23",&status);
  vvd(local_a8,0.0005791301952321297,1e-14,"iauPn06","rbpn31",&status);
  vvd(local_a0,4.02053879619523e-05,1e-14,"iauPn06","rbpn32",&status);
  vvd(local_98,0.9999998314958577,1e-12,"iauPn06","rbpn33",&status);
  iauPnm00a(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995832793134,1e-12,"iauPnm00a","11",&status);
  vvd((double)idmsf._8_8_,0.0008372384254137809,1e-14,"iauPnm00a","12",&status);
  vvd(-2.5,0.0003639684306407151,1e-14,"iauPnm00a","13",&status);
  vvd(-0.5,-0.0008372535226570394,1e-14,"iauPnm00a","21",&status);
  vvd(3.1,0.9999996486491582,1e-12,"iauPnm00a","22",&status);
  vvd(0.9,4.132915262664073e-05,1e-14,"iauPnm00a","23",&status);
  vvd(-0.00406995477,-0.0003639337004054318,1e-14,"iauPnm00a","31",&status);
  vvd(-0.00181335842,-4.163386925461776e-05,1e-14,"iauPnm00a","32",&status);
  vvd(0.00095435,0.9999999329094391,1e-12,"iauPnm00a","33",&status);
  iauPnm00b(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995832776208,1e-12,"iauPnm00b","11",&status);
  vvd((double)idmsf._8_8_,0.0008372401264429655,1e-14,"iauPnm00b","12",&status);
  vvd(-2.5,0.00036396916814502716,1e-14,"iauPnm00b","13",&status);
  vvd(-0.5,-0.0008372552234147138,1e-14,"iauPnm00b","21",&status);
  vvd(3.1,0.9999996486477686,1e-12,"iauPnm00b","22",&status);
  vvd(0.9,4.132832190946053e-05,1e-14,"iauPnm00b","23",&status);
  vvd(-0.00406995477,-0.0003639344385341866,1e-14,"iauPnm00b","31",&status);
  vvd(-0.00181335842,-4.1633039774215225e-05,1e-14,"iauPnm00b","32",&status);
  vvd(0.00095435,0.999999932909205,1e-12,"iauPnm00b","33",&status);
  iauPnm06a(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995832794205,1e-12,"iauPnm06a","11",&status);
  vvd((double)idmsf._8_8_,0.0008372382772630962,1e-14,"iauPnm06a","12",&status);
  vvd(-2.5,0.0003639684771140623,1e-14,"iauPnm06a","13",&status);
  vvd(-0.5,-0.0008372533744743683,1e-14,"iauPnm06a","21",&status);
  vvd(3.1,0.9999996486492861,1e-12,"iauPnm06a","22",&status);
  vvd(0.9,4.1329059446110195e-05,1e-14,"iauPnm06a","23",&status);
  vvd(-0.00406995477,-0.0003639337469629465,1e-14,"iauPnm06a","31",&status);
  vvd(-0.00181335842,-4.163377605910664e-05,1e-14,"iauPnm06a","32",&status);
  vvd(0.00095435,0.999999932909426,1e-12,"iauPnm06a","33",&status);
  iauPnm80(2400000.5,50123.9999,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999995831934612,1e-12,"iauPnm80","11",&status);
  vvd((double)idmsf._8_8_,0.0008373654045728124,1e-14,"iauPnm80","12",&status);
  vvd(-2.5,0.0003639121916933106,1e-14,"iauPnm80","13",&status);
  vvd(-0.5,-0.0008373804896118301,1e-14,"iauPnm80","21",&status);
  vvd(3.1,0.9999996485439674,1e-12,"iauPnm80","22",&status);
  vvd(0.9,4.13020251042155e-05,1e-14,"iauPnm80","23",&status);
  vvd(-0.00406995477,-0.0003638774789072144,1e-14,"iauPnm80","31",&status);
  vvd(-0.00181335842,-4.160674085851722e-05,1e-14,"iauPnm80","32",&status);
  vvd(0.00095435,0.9999999329310275,1e-12,"iauPnm80","33",&status);
  iauPom00(2.55060238e-07,1.860359247e-06,-1.3671745807288915e-11,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.9999999999999675,1e-12,"iauPom00","11",&status);
  vvd((double)idmsf._8_8_,-1.367174580728847e-11,1e-16,"iauPom00","12",&status);
  vvd(-2.5,2.550602379999972e-07,1e-16,"iauPom00","13",&status);
  vvd(-0.5,1.4146249479570297e-11,1e-16,"iauPom00","21",&status);
  vvd(3.1,0.9999999999982695,1e-12,"iauPom00","22",&status);
  vvd(0.9,-1.8603592469988663e-06,1e-16,"iauPom00","23",&status);
  vvd(-0.00406995477,-2.5506023797412153e-07,1e-16,"iauPom00","31",&status);
  vvd(-0.00181335842,1.860359247002414e-06,1e-16,"iauPom00","32",&status);
  vvd(0.00095435,0.999999999998237,1e-12,"iauPom00","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  iauPpp((double *)idmsf,&eo,ppr);
  vvd(ppr[0],3.0,1e-12,"iauPpp","0",&status);
  vvd(ppr[1],5.0,1e-12,"iauPpp","1",&status);
  vvd(ppr[2],7.0,1e-12,"iauPpp","2",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  iauPpsp((double *)idmsf,5.0,&eo,ppr);
  vvd(ppr[0],7.0,1e-12,"iauPpsp","0",&status);
  vvd(ppr[1],17.0,1e-12,"iauPpsp","1",&status);
  vvd(ppr[2],23.0,1e-12,"iauPpsp","2",&status);
  iauPr00(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-8.716465172668348e-08,1e-22,"iauPr00","dpsipr",&status);
  vvd(eo,-7.342018386722813e-09,1e-22,"iauPr00","depspr",&status);
  iauPrec76(2400000.5,33282.0,2400000.5,51544.0,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,0.005588961642000161,1e-12,"iauPrec76","zeta",&status);
  vvd(eo,0.005589922365870681,1e-12,"iauPrec76","z",&status);
  vvd(ppr[0],0.004858945471687297,1e-12,"iauPrec76","theta",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauPv2p((double (*) [3])idmsf,&eo);
  vvd(eo,0.3,0.0,"iauPv2p","1",&status);
  vvd(dStack_1f0,1.2,0.0,"iauPv2p","2",&status);
  vvd(local_1e8,-2.5,0.0,"iauPv2p","3",&status);
  idmsf[0] = 0x706c3a5a;
  idmsf[1] = -0x40231aaf;
  idmsf[2] = -0x3dcea4c6;
  idmsf[3] = 0x3f9fad25;
  iauPv2s((double (*) [3])idmsf,&eo,ppr,&da_1,&di_2,&rob_1,&bpia);
  vvd(eo,3.0731853071795867,1e-12,"iauPv2s","theta",&status);
  vvd(ppr[0],0.123,1e-12,"iauPv2s","phi",&status);
  vvd(da_1,0.45599999999999996,1e-12,"iauPv2s","r",&status);
  vvd(di_2,-7.8e-06,1e-16,"iauPv2s","td",&status);
  vvd(rob_1,9.010000000000002e-06,1e-16,"iauPv2s","pd",&status);
  vvd(bpia,-1.2299999999999999e-05,1e-16,"iauPv2s","rd",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  local_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0x40100000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  dStack_1e0 = 0.0;
  local_1d8 = 2.0;
  dStack_1d0 = 8.0;
  iauPvdpv((double (*) [3])idmsf,(double (*) [3])&eo,ppr);
  vvd(ppr[0],20.0,1e-12,"iauPvdpv","1",&status);
  vvd(ppr[1],50.0,1e-12,"iauPvdpv","2",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauPvm((double (*) [3])idmsf,&eo,ppr);
  vvd(eo,2.7892651361962706,1e-12,"iauPvm","r",&status);
  vvd(ppr[0],1.2144957801491119,1e-12,"iauPvm","s",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  dStack_1e0 = 3.0;
  local_1d8 = 2.0;
  dStack_1d0 = 1.0;
  iauPvmpv((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],1.0,1e-12,"iauPvmpv","11",&status);
  vvd(ppr[1],-1.0,1e-12,"iauPvmpv","21",&status);
  vvd(ppr[2],-1.0,1e-12,"iauPvmpv","31",&status);
  vvd(0.00364365824,2.0,1e-12,"iauPvmpv","12",&status);
  vvd(-0.0154287319,4.0,1e-12,"iauPvmpv","22",&status);
  vvd(-0.00668922024,2.0,1e-12,"iauPvmpv","32",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  dStack_1e0 = 3.0;
  local_1d8 = 2.0;
  dStack_1d0 = 1.0;
  iauPvppv((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],3.0,1e-12,"iauPvppv","p1",&status);
  vvd(ppr[1],5.0,1e-12,"iauPvppv","p2",&status);
  vvd(ppr[2],7.0,1e-12,"iauPvppv","p3",&status);
  vvd(0.00364365824,8.0,1e-12,"iauPvppv","v1",&status);
  vvd(-0.0154287319,8.0,1e-12,"iauPvppv","v2",&status);
  vvd(-0.00668922024,4.0,1e-12,"iauPvppv","v3",&status);
  idmsf[0] = 0x75dc0ea7;
  idmsf[1] = 0x40feecc9;
  idmsf[2] = -0x2104b2fb;
  idmsf[3] = 0x40a0b195;
  iVar2 = iauPvstar((double (*) [3])idmsf,&eo,ppr,&da_1,&di_2,&rob_1,&bpia);
  vvd(eo,0.01686756,1e-12,"iauPvstar","ra",&status);
  vvd(ppr[0],-1.093989828,1e-12,"iauPvstar","dec",&status);
  vvd(da_1,-1.7832351600004728e-05,1e-16,"iauPvstar","pmr",&status);
  vvd(di_2,2.3360240470006194e-06,1e-16,"iauPvstar","pmd",&status);
  vvd(rob_1,0.74723,1e-12,"iauPvstar","px",&status);
  vvd(bpia,-21.60000010107306,1e-11,"iauPvstar","rv",&status);
  viv(iVar2,0,"iauPvstar","j",&status);
  iauPvtob(2.0,0.5,3000.0,1e-06,-5e-07,1e-08,5.0,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,4225081.367071159,1e-05,"iauPvtob","p(1)",&status);
  vvd((double)idmsf._8_8_,3681943.215856198,1e-05,"iauPvtob","p(2)",&status);
  vvd(-245251.23398768302,3041149.3992412607,1e-05,"iauPvtob","p(3)",&status);
  vvd(-0.004051854035740713,-268.49153893659985,1e-09,"iauPvtob","v(1)",&status);
  vvd(-0.006253919754866174,308.0977983288903,1e-09,"iauPvtob","v(2)",&status);
  vvd(0.011893537197741073,0.0,0.0,"iauPvtob","v(3)",&status);
  idmsf[0] = 0x75dc0ea8;
  idmsf[1] = 0x40feecc9;
  idmsf[2] = -0x2104b2fa;
  idmsf[3] = 0x40a0b195;
  iauPvu(2920.0,(double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,126656.7598605317,1e-06,"iauPvu","p1",&status);
  vvd(dStack_1f0,2118.5312711557262,1e-08,"iauPvu","p2",&status);
  vvd(local_1e8,-245216.5048590656,1e-06,"iauPvu","p3",&status);
  vvd(dStack_1e0,-0.004051854035740713,1e-12,"iauPvu","v1",&status);
  vvd(local_1d8,-0.006253919754866176,1e-12,"iauPvu","v2",&status);
  vvd(dStack_1d0,0.011893537197741076,1e-12,"iauPvu","v3",&status);
  idmsf[0] = 0x75dc0ea8;
  idmsf[1] = 0x40feecc9;
  idmsf[2] = -0x2104b2fa;
  idmsf[3] = 0x40a0b195;
  iauPvup(2920.0,(double (*) [3])idmsf,&eo);
  vvd(eo,126656.7598605317,1e-06,"iauPvup","1",&status);
  vvd(dStack_1f0,2118.5312711557262,1e-08,"iauPvup","2",&status);
  vvd(local_1e8,-245216.5048590656,1e-06,"iauPvup","3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  dStack_1e0 = 0.0;
  local_1d8 = 2.0;
  dStack_1d0 = 8.0;
  iauPvxpv((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],-1.0,1e-12,"iauPvxpv","p1",&status);
  vvd(ppr[1],-5.0,1e-12,"iauPvxpv","p2",&status);
  vvd(ppr[2],4.0,1e-12,"iauPvxpv","p3",&status);
  vvd(0.00364365824,-2.0,1e-12,"iauPvxpv","v1",&status);
  vvd(-0.0154287319,-36.0,1e-12,"iauPvxpv","v2",&status);
  vvd(-0.00668922024,22.0,1e-12,"iauPvxpv","v3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40000000;
  eo = 1.0;
  dStack_1f0 = 3.0;
  local_1e8 = 4.0;
  iauPxp((double *)idmsf,&eo,ppr);
  vvd(ppr[0],-1.0,1e-12,"iauPxp","1",&status);
  vvd(ppr[1],-5.0,1e-12,"iauPxp","2",&status);
  vvd(ppr[2],4.0,1e-12,"iauPxp","3",&status);
  iauRefco(800.0,10.0,0.9,0.4,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.0002264949956241415,1e-15,"iauRefco","refa",&status);
  vvd(eo,-2.598658261729344e-07,1e-18,"iauRefco","refb",&status);
  idmsf[0] = 0;
  idmsf[1] = 0;
  idmsf[2] = -0x66666666;
  idmsf[3] = -0x40166667;
  iauRm2v((double (*) [3])idmsf,&eo);
  vvd(eo,0.0,1e-12,"iauRm2v","1",&status);
  vvd(dStack_1f0,1.413716694115407,1e-12,"iauRm2v","2",&status);
  vvd(local_1e8,-1.8849555921538759,1e-12,"iauRm2v","3",&status);
  eo = 0.0;
  dStack_1f0 = 1.41371669;
  local_1e8 = -1.88495559;
  iauRv2m(&eo,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,-0.707106778222112,1e-14,"iauRv2m","11",&status);
  vvd((double)idmsf._8_8_,-0.565685427680913,1e-14,"iauRv2m","12",&status);
  vvd(-0.6,-0.4242640700104211,1e-14,"iauRv2m","13",&status);
  vvd(0.8,0.565685427680913,1e-14,"iauRv2m","21",&status);
  vvd(-0.36,-0.09254833945322742,1e-14,"iauRv2m","22",&status);
  vvd(0.48,-0.8194112531408834,1e-14,"iauRv2m","23",&status);
  vvd(0.6,0.4242640700104211,1e-14,"iauRv2m","31",&status);
  vvd(0.48,-0.8194112531408834,1e-14,"iauRv2m","32",&status);
  vvd(-0.64,0.38544156123111545,1e-14,"iauRv2m","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauRx(0.3456789,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,2.0,0.0,"iauRx","11",&status);
  vvd((double)idmsf._8_8_,3.0,0.0,"iauRx","12",&status);
  vvd(2.0,2.0,0.0,"iauRx","13",&status);
  vvd(3.0,3.8390433882356123,1e-12,"iauRx","21",&status);
  vvd(2.0,3.237033249594112,1e-12,"iauRx","22",&status);
  vvd(3.0,4.5167143790059825,1e-12,"iauRx","23",&status);
  vvd(3.0,1.8060304159245018,1e-12,"iauRx","31",&status);
  vvd(4.0,3.0857115453363724,1e-12,"iauRx","32",&status);
  vvd(5.0,3.6877216839778733,1e-12,"iauRx","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  eo = 0.2;
  dStack_1f0 = 1.5;
  local_1e8 = 0.1;
  iauRxp((double (*) [3])idmsf,&eo,ppr);
  vvd(ppr[0],5.1,1e-12,"iauRxp","1",&status);
  vvd(ppr[1],3.9,1e-12,"iauRxp","2",&status);
  vvd(ppr[2],7.1,1e-12,"iauRxp","3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  eo = 0.2;
  dStack_1f0 = 1.5;
  local_1e8 = 0.1;
  dStack_1e0 = 1.5;
  local_1d8 = 0.2;
  dStack_1d0 = 0.1;
  iauRxpv((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],5.1,1e-12,"iauRxpv","11",&status);
  vvd(0.00364365824,3.8,1e-12,"iauRxpv","12",&status);
  vvd(ppr[1],3.9,1e-12,"iauRxpv","21",&status);
  vvd(-0.0154287319,5.2,1e-12,"iauRxpv","22",&status);
  vvd(ppr[2],7.1,1e-12,"iauRxpv","31",&status);
  vvd(-0.00668922024,5.8,1e-12,"iauRxpv","32",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  eo = 1.0;
  dStack_1f0 = 2.0;
  local_1e8 = 2.0;
  dStack_1e0 = 4.0;
  local_1d8 = 1.0;
  dStack_1d0 = 1.0;
  local_1c8 = 3.0;
  dStack_1c0 = 0.0;
  local_1b8 = 1.0;
  iauRxr((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],20.0,1e-12,"iauRxr","11",&status);
  vvd(ppr[1],7.0,1e-12,"iauRxr","12",&status);
  vvd(ppr[2],9.0,1e-12,"iauRxr","13",&status);
  vvd(0.00364365824,20.0,1e-12,"iauRxr","21",&status);
  vvd(-0.0154287319,8.0,1e-12,"iauRxr","22",&status);
  vvd(-0.00668922024,11.0,1e-12,"iauRxr","23",&status);
  vvd(local_318,34.0,1e-12,"iauRxr","31",&status);
  vvd(local_310,10.0,1e-12,"iauRxr","32",&status);
  vvd(local_308,15.0,1e-12,"iauRxr","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauRy(0.3456789,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.865184781897816,1e-12,"iauRy","11",&status);
  vvd((double)idmsf._8_8_,1.4671949205393167,1e-12,"iauRy","12",&status);
  vvd(2.0,0.18751379112744573,1e-12,"iauRy","13",&status);
  vvd(3.0,3.0,1e-12,"iauRy","21",&status);
  vvd(2.0,2.0,1e-12,"iauRy","22",&status);
  vvd(3.0,3.0,1e-12,"iauRy","23",&status);
  vvd(3.0,3.5002078928504274,1e-12,"iauRy","31",&status);
  vvd(4.0,4.7798890222622985,1e-12,"iauRy","32",&status);
  vvd(5.0,5.3818991609037985,1e-12,"iauRy","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauRz(0.3456789,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,2.8981977542089266,1e-12,"iauRz","11",&status);
  vvd((double)idmsf._8_8_,3.5002078928504274,1e-12,"iauRz","12",&status);
  vvd(2.0,2.8981977542089266,1e-12,"iauRz","13",&status);
  vvd(3.0,2.1448659113096866,1e-12,"iauRz","21",&status);
  vvd(2.0,0.865184781897816,1e-12,"iauRz","22",&status);
  vvd(3.0,2.1448659113096866,1e-12,"iauRz","23",&status);
  vvd(3.0,3.0,1e-12,"iauRz","31",&status);
  vvd(4.0,4.0,1e-12,"iauRz","32",&status);
  vvd(5.0,5.0,1e-12,"iauRz","33",&status);
  dVar1 = iauS00a(2400000.5,52541.0);
  vvd(dVar1,-1.3406844489191635e-08,1e-18,"iauS00a","",&status);
  dVar1 = iauS00b(2400000.5,52541.0);
  vvd(dVar1,-1.3406957829510266e-08,1e-18,"iauS00b","",&status);
  dVar1 = iauS00(2400000.5,53736.0,0.0005791308486706011,4.020579816732961e-05);
  vvd(dVar1,-1.2200362632709057e-08,1e-18,"iauS00","",&status);
  dVar1 = iauS06a(2400000.5,52541.0);
  vvd(dVar1,-1.3406804372918124e-08,1e-18,"iauS06a","",&status);
  dVar1 = iauS06(2400000.5,53736.0,0.0005791308486706011,4.020579816732961e-05);
  vvd(dVar1,-1.220032213076463e-08,1e-18,"iauS06","",&status);
  iauS2c(3.0123,-0.999,(double *)idmsf);
  vvd((double)idmsf._0_8_,-0.5366267667260524,1e-12,"iauS2c","1",&status);
  vvd((double)idmsf._8_8_,0.06977111097651453,1e-12,"iauS2c","2",&status);
  vvd(2.0,-0.8409302618566215,1e-12,"iauS2c","3",&status);
  iauS2p(-3.21,0.123,0.456,(double *)idmsf);
  vvd((double)idmsf._0_8_,-0.4514964673880165,1e-12,"iauS2p","x",&status);
  vvd((double)idmsf._8_8_,0.030933942773425867,1e-12,"iauS2p","y",&status);
  vvd(2.0,0.05594668105108779,1e-12,"iauS2p","z",&status);
  iauS2pv(-3.21,0.123,0.456,-7.8e-06,9.01e-06,-1.23e-05,(double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,-0.4514964673880165,1e-12,"iauS2pv","x",&status);
  vvd((double)idmsf._8_8_,0.030933942773425867,1e-12,"iauS2pv","y",&status);
  vvd(2.0,0.05594668105108779,1e-12,"iauS2pv","z",&status);
  vvd(3.0,1.2922708506632602e-05,1e-16,"iauS2pv","vx",&status);
  vvd(2.0,2.6528141820606914e-06,1e-16,"iauS2pv","vy",&status);
  vvd(3.0,2.568431853930292e-06,1e-16,"iauS2pv","vz",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauS2xpv(2.0,3.0,(double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,0.6,1e-12,"iauS2xpv","p1",&status);
  vvd(dStack_1f0,2.4,1e-12,"iauS2xpv","p2",&status);
  vvd(local_1e8,-5.0,1e-12,"iauS2xpv","p3",&status);
  vvd(dStack_1e0,1.5,1e-12,"iauS2xpv","v1",&status);
  vvd(local_1d8,6.9,1e-12,"iauS2xpv","v2",&status);
  vvd(dStack_1d0,-1.2,1e-12,"iauS2xpv","v3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x3ff00000;
  idmsf[2] = -0x66666666;
  idmsf[3] = 0x3fb99999;
  eo = -3.0;
  dStack_1f0 = 0.001;
  local_1e8 = 0.2;
  dVar1 = iauSepp((double *)idmsf,&eo);
  vvd(dVar1,2.8603919190246607,1e-12,"iauSepp","",&status);
  dVar1 = iauSeps(1.0,0.1,0.2,-3.0);
  vvd(dVar1,2.3467220169969987,1e-14,"iauSeps","",&status);
  dVar1 = iauSp00(2400000.5,52541.0);
  vvd(dVar1,-6.216698469981019e-12,1e-12,"iauSp00","",&status);
  iVar2 = iauStarpm(0.01686756,-1.093989828,-1.78323516e-05,2.336024047e-06,0.74723,-21.6,2400000.5,
                    50083.0,2400000.5,53736.0,(double *)idmsf,&eo,ppr,&da_1,&di_2,&rob_1);
  vvd((double)idmsf._0_8_,0.016689190694142562,1e-13,"iauStarpm","ra",&status);
  vvd(eo,-1.093966454217128,1e-13,"iauStarpm","dec",&status);
  vvd(ppr[0],-1.7836626821531766e-05,1e-17,"iauStarpm","pmr",&status);
  vvd(da_1,2.3380929159839896e-06,1e-17,"iauStarpm","pmd",&status);
  vvd(di_2,0.7473533835317719,1e-13,"iauStarpm","px",&status);
  vvd(rob_1,-21.59905170476417,1e-11,"iauStarpm","rv",&status);
  viv(iVar2,0,"iauStarpm","j",&status);
  iVar2 = iauStarpv(0.01686756,-1.093989828,-1.78323516e-05,2.336024047e-06,0.74723,-21.6,
                    (double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,126668.59127431606,1e-10,"iauStarpv","11",&status);
  vvd((double)idmsf._8_8_,2136.792716839935,1e-12,"iauStarpv","12",&status);
  vvd(0.2,-245251.23398768302,1e-10,"iauStarpv","13",&status);
  vvd(0.5,-0.00405185400895566,1e-13,"iauStarpv","21",&status);
  vvd(2.3,-0.006253919754414778,1e-15,"iauStarpv","22",&status);
  vvd(-0.4,0.011893537145881093,1e-13,"iauStarpv","23",&status);
  viv(iVar2,0,"iauStarpv","j",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauSxp(2.0,(double *)idmsf,&eo);
  vvd(eo,0.6,0.0,"iauSxp","1",&status);
  vvd(dStack_1f0,2.4,0.0,"iauSxp","2",&status);
  vvd(local_1e8,-5.0,0.0,"iauSxp","3",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauSxpv(2.0,(double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,0.6,0.0,"iauSxpv","p1",&status);
  vvd(dStack_1f0,2.4,0.0,"iauSxpv","p2",&status);
  vvd(local_1e8,-5.0,0.0,"iauSxpv","p3",&status);
  vvd(dStack_1e0,1.0,0.0,"iauSxpv","v1",&status);
  vvd(local_1d8,6.4,0.0,"iauSxpv","v2",&status);
  vvd(dStack_1d0,-1.4,0.0,"iauSxpv","v3",&status);
  iVar2 = iauTaitt(2453750.5,0.892482639,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTaitt","t1",&status);
  vvd(eo,0.892855139,1e-12,"iauTaitt","t2",&status);
  viv(iVar2,0,"iauTaitt","j",&status);
  iVar2 = iauTaiut1(2453750.5,0.892482639,-32.6659,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTaiut1","u1",&status);
  vvd(eo,0.8921045614537036,1e-12,"iauTaiut1","u2",&status);
  viv(iVar2,0,"iauTaiut1","j",&status);
  iVar2 = iauTaiutc(2453750.5,0.892482639,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTaiutc","u1",&status);
  vvd(eo,0.8921006945555555,1e-12,"iauTaiutc","u2",&status);
  viv(iVar2,0,"iauTaiutc","j",&status);
  iVar2 = iauTcbtdb(2453750.5,0.893019599,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTcbtdb","b1",&status);
  vvd(eo,0.8928551362746343,1e-12,"iauTcbtdb","b2",&status);
  viv(iVar2,0,"iauTcbtdb","j",&status);
  iVar2 = iauTcgtt(2453750.5,0.892862531,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTcgtt","t1",&status);
  vvd(eo,0.8928551387488817,1e-12,"iauTcgtt","t2",&status);
  viv(iVar2,0,"iauTcgtt","j",&status);
  iVar2 = iauTdbtcb(2453750.5,0.892855137,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTdbtcb","b1",&status);
  vvd(eo,0.8930195997253657,1e-12,"iauTdbtcb","b2",&status);
  viv(iVar2,0,"iauTdbtcb","j",&status);
  iVar2 = iauTdbtt(2453750.5,0.892855137,-0.000201,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTdbtt","t1",&status);
  vvd(eo,0.8928551393263889,1e-12,"iauTdbtt","t2",&status);
  viv(iVar2,0,"iauTdbtt","j",&status);
  iVar2 = iauTf2a('+',4,0x3a,20.2,(double *)idmsf);
  vvd((double)idmsf._0_8_,1.3017392781895374,1e-12,"iauTf2a","a",&status);
  viv(iVar2,0,"iauTf2a","j",&status);
  iVar2 = iauTf2d(' ',0x17,0x37,10.9,(double *)idmsf);
  vvd((double)idmsf._0_8_,0.9966539351851852,1e-12,"iauTf2d","d",&status);
  viv(iVar2,0,"iauTf2d","j",&status);
  iVar2 = iauTpors(-0.03,0.07,1.3,1.5,(double *)idmsf,&eo,ppr,&da_1);
  vvd((double)idmsf._0_8_,1.7366215777832088,1e-13,"iauTpors","az1",&status);
  vvd(eo,1.4367365618440904,1e-13,"iauTpors","bz1",&status);
  vvd(ppr[0],4.004971075806584,1e-13,"iauTpors","az2",&status);
  vvd(da_1,1.565084088476418,1e-13,"iauTpors","bz2",&status);
  viv(iVar2,2,"iauTpors","n",&status);
  iauS2c(1.3,1.5,(double *)idmsf);
  iVar2 = iauTporv(-0.03,0.07,(double *)idmsf,&eo,ppr);
  vvd(eo,-0.022062528223668887,1e-15,"iauTporv","x1",&status);
  vvd(dStack_1f0,0.1318251060359645,1e-14,"iauTporv","y1",&status);
  vvd(local_1e8,0.9910274397144544,1e-14,"iauTporv","z1",&status);
  vvd(ppr[0],-0.0037122117638019683,1e-16,"iauTporv","x2",&status);
  vvd(ppr[1],-0.0043415199562998365,1e-16,"iauTporv","y2",&status);
  vvd(ppr[2],0.9999836852110587,1e-14,"iauTporv","z2",&status);
  viv(iVar2,2,"iauTporv","n",&status);
  iauTpsts(-0.03,0.07,2.3,1.5,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.759612716735963,1e-14,"iauTpsts","ra",&status);
  vvd(eo,1.5408646451092631,1e-13,"iauTpsts","dec",&status);
  iauS2c(2.3,1.5,(double *)idmsf);
  iauTpstv(-0.03,0.07,(double *)idmsf,&eo);
  vvd(eo,0.021700304549073766,1e-15,"iauTpstv","x",&status);
  vvd(dStack_1f0,0.020609095905353675,1e-15,"iauTpstv","y",&status);
  vvd(local_1e8,0.9995520806583523,1e-14,"iauTpstv","z",&status);
  iVar2 = iauTpxes(1.3,1.55,2.3,1.5,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,-0.017532009832369806,1e-15,"iauTpxes","xi",&status);
  vvd(eo,0.05962940005778713,1e-15,"iauTpxes","eta",&status);
  viv(iVar2,0,"iauTpxes","j",&status);
  iauS2c(1.3,1.55,(double *)idmsf);
  iauS2c(2.3,1.5,&eo);
  iVar2 = iauTpxev((double *)idmsf,&eo,ppr,&da_1);
  vvd(ppr[0],-0.017532009832369806,1e-15,"iauTpxev","xi",&status);
  vvd(da_1,0.05962940005778713,1e-15,"iauTpxev","eta",&status);
  viv(iVar2,0,"iauTpxev","j",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauTr((double (*) [3])idmsf,(double (*) [3])&eo);
  vvd(eo,2.0,0.0,"iauTr","11",&status);
  vvd(dStack_1f0,3.0,0.0,"iauTr","12",&status);
  vvd(local_1e8,3.0,0.0,"iauTr","13",&status);
  vvd(dStack_1e0,3.0,0.0,"iauTr","21",&status);
  vvd(local_1d8,2.0,0.0,"iauTr","22",&status);
  vvd(dStack_1d0,4.0,0.0,"iauTr","23",&status);
  vvd(local_1c8,2.0,0.0,"iauTr","31",&status);
  vvd(dStack_1c0,3.0,0.0,"iauTr","32",&status);
  vvd(local_1b8,5.0,0.0,"iauTr","33",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  eo = 0.2;
  dStack_1f0 = 1.5;
  local_1e8 = 0.1;
  iauTrxp((double (*) [3])idmsf,&eo,ppr);
  vvd(ppr[0],5.2,1e-12,"iauTrxp","1",&status);
  vvd(ppr[1],4.0,1e-12,"iauTrxp","2",&status);
  vvd(ppr[2],5.4,1e-12,"iauTrxp","3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  eo = 0.2;
  dStack_1f0 = 1.5;
  local_1e8 = 0.1;
  dStack_1e0 = 1.5;
  local_1d8 = 0.2;
  dStack_1d0 = 0.1;
  iauTrxpv((double (*) [3])idmsf,(double (*) [3])&eo,&ppr);
  vvd(ppr[0],5.2,1e-12,"iauTrxpv","p1",&status);
  vvd(ppr[1],4.0,1e-12,"iauTrxpv","p1",&status);
  vvd(ppr[2],5.4,1e-12,"iauTrxpv","p1",&status);
  vvd(0.00364365824,3.9,1e-12,"iauTrxpv","v1",&status);
  vvd(-0.0154287319,5.3,1e-12,"iauTrxpv","v2",&status);
  vvd(-0.00668922024,4.1,1e-12,"iauTrxpv","v3",&status);
  iVar2 = iauTttai(2453750.5,0.892482639,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTttai","a1",&status);
  vvd(eo,0.892110139,1e-12,"iauTttai","a2",&status);
  viv(iVar2,0,"iauTttai","j",&status);
  iVar2 = iauTttcg(2453750.5,0.892482639,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTttcg","g1",&status);
  vvd(eo,0.8924900312508587,1e-12,"iauTttcg","g2",&status);
  viv(iVar2,0,"iauTttcg","j",&status);
  iVar2 = iauTttdb(2453750.5,0.892855139,-0.000201,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTttdb","b1",&status);
  vvd(eo,0.8928551366736112,1e-12,"iauTttdb","b2",&status);
  viv(iVar2,0,"iauTttdb","j",&status);
  iVar2 = iauTtut1(2453750.5,0.892855139,64.8499,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauTtut1","u1",&status);
  vvd(eo,0.8921045614537036,1e-12,"iauTtut1","u2",&status);
  viv(iVar2,0,"iauTtut1","j",&status);
  iVar2 = iauUt1tai(2453750.5,0.892104561,-32.6659,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauUt1tai","a1",&status);
  vvd(eo,0.8924826385462963,1e-12,"iauUt1tai","a2",&status);
  viv(iVar2,0,"iauUt1tai","j",&status);
  iVar2 = iauUt1tt(2453750.5,0.892104561,64.8499,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauUt1tt","t1",&status);
  vvd(eo,0.8928551385462963,1e-12,"iauUt1tt","t2",&status);
  viv(iVar2,0,"iauUt1tt","j",&status);
  iVar2 = iauUt1utc(2453750.5,0.892104561,0.3341,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauUt1utc","u1",&status);
  vvd(eo,0.8921006941018519,1e-12,"iauUt1utc","u2",&status);
  viv(iVar2,0,"iauUt1utc","j",&status);
  iVar2 = iauUtctai(2453750.5,0.892100694,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauUtctai","u1",&status);
  vvd(eo,0.8924826384444444,1e-12,"iauUtctai","u2",&status);
  viv(iVar2,0,"iauUtctai","j",&status);
  iVar2 = iauUtcut1(2453750.5,0.892100694,0.3341,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,2453750.5,1e-06,"iauUtcut1","u1",&status);
  vvd(eo,0.8921045608981482,1e-12,"iauUtcut1","u2",&status);
  viv(iVar2,0,"iauUtcut1","j",&status);
  iauXy06(2400000.5,53736.0,(double *)idmsf,&eo);
  vvd((double)idmsf._0_8_,0.0005791308486706011,1e-15,"iauXy06","x",&status);
  vvd(eo,4.020579816732958e-05,1e-16,"iauXy06","y",&status);
  iauXys00a(2400000.5,53736.0,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,0.0005791308472168153,1e-14,"iauXys00a","x",&status);
  vvd(eo,4.0205956615915e-05,1e-15,"iauXys00a","y",&status);
  vvd(ppr[0],-1.2200408484715497e-08,1e-18,"iauXys00a","s",&status);
  iauXys00b(2400000.5,53736.0,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,0.0005791301929950209,1e-14,"iauXys00b","x",&status);
  vvd(eo,4.0205536813737205e-05,1e-15,"iauXys00b","y",&status);
  vvd(ppr[0],-1.2200273772850832e-08,1e-18,"iauXys00b","s",&status);
  iauXys06a(2400000.5,53736.0,(double *)idmsf,&eo,ppr);
  vvd((double)idmsf._0_8_,0.0005791308482835292,1e-14,"iauXys06a","x",&status);
  vvd(eo,4.0205800994540205e-05,1e-15,"iauXys06a","y",&status);
  vvd(ppr[0],-1.22003229416458e-08,1e-18,"iauXys06a","s",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauZp((double *)idmsf);
  vvd((double)idmsf._0_8_,0.0,0.0,"iauZp","1",&status);
  vvd((double)idmsf._8_8_,0.0,0.0,"iauZp","2",&status);
  vvd(-2.5,0.0,0.0,"iauZp","3",&status);
  idmsf[0] = 0x33333333;
  idmsf[1] = 0x3fd33333;
  idmsf[2] = 0x33333333;
  idmsf[3] = 0x3ff33333;
  iauZpv((double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.0,0.0,"iauZpv","p1",&status);
  vvd((double)idmsf._8_8_,0.0,0.0,"iauZpv","p2",&status);
  vvd(-2.5,0.0,0.0,"iauZpv","p3",&status);
  vvd(-0.5,0.0,0.0,"iauZpv","v1",&status);
  vvd(3.1,0.0,0.0,"iauZpv","v2",&status);
  vvd(0.9,0.0,0.0,"iauZpv","v3",&status);
  idmsf[0] = 0;
  idmsf[1] = 0x40000000;
  idmsf[2] = 0;
  idmsf[3] = 0x40080000;
  iauZr((double (*) [3])idmsf);
  vvd((double)idmsf._0_8_,0.0,0.0,"iauZr","00",&status);
  vvd(3.0,0.0,0.0,"iauZr","01",&status);
  vvd(2.0,0.0,0.0,"iauZr","02",&status);
  vvd((double)idmsf._8_8_,0.0,0.0,"iauZr","10",&status);
  vvd(2.0,0.0,0.0,"iauZr","11",&status);
  vvd(3.0,0.0,0.0,"iauZr","12",&status);
  vvd(3.0,0.0,0.0,"iauZr","20",&status);
  vvd(4.0,0.0,0.0,"iauZr","21",&status);
  vvd(5.0,0.0,0.0,"iauZr","22",&status);
  __s = "t_sofa_c validation failed!";
  if (status == 0) {
    __s = "t_sofa_c validation successful";
  }
  puts(__s);
  return status;
}

Assistant:

int main(int argc, char *argv[])
/*
**  - - - - -
**   m a i n
**  - - - - -
**
**  This revision:  2021 April 18
*/
{
   int status;


/* If any command-line argument, switch to verbose reporting. */
   if (argc > 1) {
      verbose = 1;
      argv[0][0] += 0;    /* to avoid compiler warnings */
   }

/* Preset the &status to FALSE = success. */
   status = 0;

/* Test all of the SOFA functions. */
   t_a2af(&status);
   t_a2tf(&status);
   t_ab(&status);
   t_ae2hd(&status);
   t_af2a(&status);
   t_anp(&status);
   t_anpm(&status);
   t_apcg(&status);
   t_apcg13(&status);
   t_apci(&status);
   t_apci13(&status);
   t_apco(&status);
   t_apco13(&status);
   t_apcs(&status);
   t_apcs13(&status);
   t_aper(&status);
   t_aper13(&status);
   t_apio(&status);
   t_apio13(&status);
   t_atcc13(&status);
   t_atccq(&status);
   t_atci13(&status);
   t_atciq(&status);
   t_atciqn(&status);
   t_atciqz(&status);
   t_atco13(&status);
   t_atic13(&status);
   t_aticq(&status);
   t_aticqn(&status);
   t_atio13(&status);
   t_atioq(&status);
   t_atoc13(&status);
   t_atoi13(&status);
   t_atoiq(&status);
   t_bi00(&status);
   t_bp00(&status);
   t_bp06(&status);
   t_bpn2xy(&status);
   t_c2i00a(&status);
   t_c2i00b(&status);
   t_c2i06a(&status);
   t_c2ibpn(&status);
   t_c2ixy(&status);
   t_c2ixys(&status);
   t_c2s(&status);
   t_c2t00a(&status);
   t_c2t00b(&status);
   t_c2t06a(&status);
   t_c2tcio(&status);
   t_c2teqx(&status);
   t_c2tpe(&status);
   t_c2txy(&status);
   t_cal2jd(&status);
   t_cp(&status);
   t_cpv(&status);
   t_cr(&status);
   t_d2dtf(&status);
   t_d2tf(&status);
   t_dat(&status);
   t_dtdb(&status);
   t_dtf2d(&status);
   t_eceq06(&status);
   t_ecm06(&status);
   t_ee00(&status);
   t_ee00a(&status);
   t_ee00b(&status);
   t_ee06a(&status);
   t_eect00(&status);
   t_eform(&status);
   t_eo06a(&status);
   t_eors(&status);
   t_epb(&status);
   t_epb2jd(&status);
   t_epj(&status);
   t_epj2jd(&status);
   t_epv00(&status);
   t_eqec06(&status);
   t_eqeq94(&status);
   t_era00(&status);
   t_fad03(&status);
   t_fae03(&status);
   t_faf03(&status);
   t_faju03(&status);
   t_fal03(&status);
   t_falp03(&status);
   t_fama03(&status);
   t_fame03(&status);
   t_fane03(&status);
   t_faom03(&status);
   t_fapa03(&status);
   t_fasa03(&status);
   t_faur03(&status);
   t_fave03(&status);
   t_fk425(&status);
   t_fk45z(&status);
   t_fk524(&status);
   t_fk52h(&status);
   t_fk54z(&status);
   t_fk5hip(&status);
   t_fk5hz(&status);
   t_fw2m(&status);
   t_fw2xy(&status);
   t_g2icrs(&status);
   t_gc2gd(&status);
   t_gc2gde(&status);
   t_gd2gc(&status);
   t_gd2gce(&status);
   t_gmst00(&status);
   t_gmst06(&status);
   t_gmst82(&status);
   t_gst00a(&status);
   t_gst00b(&status);
   t_gst06(&status);
   t_gst06a(&status);
   t_gst94(&status);
   t_h2fk5(&status);
   t_hd2ae(&status);
   t_hd2pa(&status);
   t_hfk5z(&status);
   t_icrs2g(&status);
   t_ir(&status);
   t_jd2cal(&status);
   t_jdcalf(&status);
   t_ld(&status);
   t_ldn(&status);
   t_ldsun(&status);
   t_lteceq(&status);
   t_ltecm(&status);
   t_lteqec(&status);
   t_ltp(&status);
   t_ltpb(&status);
   t_ltpecl(&status);
   t_ltpequ(&status);
   t_moon98(&status);
   t_num00a(&status);
   t_num00b(&status);
   t_num06a(&status);
   t_numat(&status);
   t_nut00a(&status);
   t_nut00b(&status);
   t_nut06a(&status);
   t_nut80(&status);
   t_nutm80(&status);
   t_obl06(&status);
   t_obl80(&status);
   t_p06e(&status);
   t_p2pv(&status);
   t_p2s(&status);
   t_pap(&status);
   t_pas(&status);
   t_pb06(&status);
   t_pdp(&status);
   t_pfw06(&status);
   t_plan94(&status);
   t_pmat00(&status);
   t_pmat06(&status);
   t_pmat76(&status);
   t_pm(&status);
   t_pmp(&status);
   t_pmpx(&status);
   t_pmsafe(&status);
   t_pn(&status);
   t_pn00(&status);
   t_pn00a(&status);
   t_pn00b(&status);
   t_pn06a(&status);
   t_pn06(&status);
   t_pnm00a(&status);
   t_pnm00b(&status);
   t_pnm06a(&status);
   t_pnm80(&status);
   t_pom00(&status);
   t_ppp(&status);
   t_ppsp(&status);
   t_pr00(&status);
   t_prec76(&status);
   t_pv2p(&status);
   t_pv2s(&status);
   t_pvdpv(&status);
   t_pvm(&status);
   t_pvmpv(&status);
   t_pvppv(&status);
   t_pvstar(&status);
   t_pvtob(&status);
   t_pvu(&status);
   t_pvup(&status);
   t_pvxpv(&status);
   t_pxp(&status);
   t_refco(&status);
   t_rm2v(&status);
   t_rv2m(&status);
   t_rx(&status);
   t_rxp(&status);
   t_rxpv(&status);
   t_rxr(&status);
   t_ry(&status);
   t_rz(&status);
   t_s00a(&status);
   t_s00b(&status);
   t_s00(&status);
   t_s06a(&status);
   t_s06(&status);
   t_s2c(&status);
   t_s2p(&status);
   t_s2pv(&status);
   t_s2xpv(&status);
   t_sepp(&status);
   t_seps(&status);
   t_sp00(&status);
   t_starpm(&status);
   t_starpv(&status);
   t_sxp(&status);
   t_sxpv(&status);
   t_taitt(&status);
   t_taiut1(&status);
   t_taiutc(&status);
   t_tcbtdb(&status);
   t_tcgtt(&status);
   t_tdbtcb(&status);
   t_tdbtt(&status);
   t_tf2a(&status);
   t_tf2d(&status);
   t_tpors(&status);
   t_tporv(&status);
   t_tpsts(&status);
   t_tpstv(&status);
   t_tpxes(&status);
   t_tpxev(&status);
   t_tr(&status);
   t_trxp(&status);
   t_trxpv(&status);
   t_tttai(&status);
   t_tttcg(&status);
   t_tttdb(&status);
   t_ttut1(&status);
   t_ut1tai(&status);
   t_ut1tt(&status) ;
   t_ut1utc(&status);
   t_utctai(&status);
   t_utcut1(&status);
   t_xy06(&status);
   t_xys00a(&status);
   t_xys00b(&status);
   t_xys06a(&status);
   t_zp(&status);
   t_zpv(&status);
   t_zr(&status);

/* Report, set up an appropriate exit status, and finish. */
   if (status) {
      printf("t_sofa_c validation failed!\n");
   } else {
      printf("t_sofa_c validation successful\n");
   }
   return status;
}